

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O0

void ihevc_intra_pred_luma_mode_3_to_9_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  WORD32 WVar1;
  undefined4 uVar2;
  undefined2 uVar3;
  undefined6 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined4 uVar7;
  undefined6 uVar8;
  undefined2 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  short sVar73;
  int in_ECX;
  undefined8 *in_RDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  ulong uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ulong uVar82;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  __m128i src_temp12_8x16b_1;
  __m128i src_temp11_8x16b_1;
  __m128i src_temp8_8x16b_1;
  __m128i src_temp7_8x16b_2;
  __m128i src_temp6_8x16b_2;
  __m128i src_temp5_8x16b_2;
  __m128i src_temp4_8x16b_2;
  __m128i src_temp3_8x16b_2;
  __m128i src_temp2_8x16b_2;
  __m128i src_temp1_8x16b_2;
  __m128i temp14_8x16b_1;
  __m128i temp13_8x16b_1;
  __m128i temp12_8x16b_1;
  __m128i temp11_8x16b_1;
  __m128i temp4_8x16b_2;
  __m128i temp3_8x16b_2;
  __m128i temp2_8x16b_2;
  __m128i temp1_8x16b_2;
  __m128i fract8_8x16b_1;
  __m128i fract3_8x16b_1;
  __m128i fract2_8x16b_2;
  __m128i fract1_8x16b_2;
  WORD16 pi2_ref_main_idx8_1;
  WORD16 pi2_ref_main_idx7_1;
  WORD16 pi2_ref_main_idx6_1;
  WORD16 pi2_ref_main_idx5_1;
  WORD16 pi2_ref_main_idx4_1;
  WORD16 pi2_ref_main_idx3_1;
  WORD16 pi2_ref_main_idx2_1;
  WORD16 pi2_ref_main_idx1_1;
  __m128i src_temp18_8x16b;
  __m128i src_temp17_8x16b;
  __m128i src_temp16_8x16b;
  __m128i src_temp15_8x16b;
  __m128i src_temp14_8x16b;
  __m128i src_temp13_8x16b;
  __m128i src_temp12_8x16b;
  __m128i src_temp11_8x16b;
  __m128i src_temp8_8x16b;
  __m128i src_temp7_8x16b_1;
  __m128i src_temp6_8x16b_1;
  __m128i src_temp5_8x16b_1;
  __m128i src_temp4_8x16b_1;
  __m128i src_temp3_8x16b_1;
  __m128i src_temp2_8x16b_1;
  __m128i src_temp1_8x16b_1;
  __m128i temp14_8x16b;
  __m128i temp13_8x16b;
  __m128i temp12_8x16b;
  __m128i temp11_8x16b;
  __m128i temp4_8x16b_1;
  __m128i temp3_8x16b_1;
  __m128i temp2_8x16b_1;
  __m128i temp1_8x16b_1;
  __m128i fract8_8x16b;
  __m128i fract3_8x16b;
  __m128i fract2_8x16b_1;
  __m128i fract1_8x16b_1;
  WORD16 pi2_ref_main_idx8;
  WORD16 pi2_ref_main_idx7;
  WORD16 pi2_ref_main_idx6;
  WORD16 pi2_ref_main_idx5;
  WORD16 pi2_ref_main_idx4;
  WORD16 pi2_ref_main_idx3;
  WORD16 pi2_ref_main_idx2;
  WORD16 pi2_ref_main_idx1;
  __m128i ref_main_temp2;
  __m128i ref_main_temp1;
  __m128i ref_main_temp0;
  __m128i src_temp7_8x16b;
  __m128i src_temp6_8x16b;
  __m128i src_temp5_8x16b;
  __m128i src_temp4_8x16b;
  __m128i src_temp3_8x16b;
  __m128i src_temp2_8x16b;
  __m128i src_temp1_8x16b;
  __m128i temp4_8x16b;
  __m128i temp3_8x16b;
  __m128i temp2_8x16b;
  __m128i temp1_8x16b;
  __m128i fract2_8x16b;
  __m128i fract1_8x16b;
  int temp41;
  int temp31;
  int temp21;
  int temp11;
  WORD32 ref_main_idx4;
  WORD32 ref_main_idx3;
  WORD32 ref_main_idx2;
  WORD32 ref_main_idx1;
  __m128i sm3;
  __m128i res_temp5_4x32b;
  __m128i ref_main_idx_4x32b;
  __m128i two_nt_4x32b;
  __m128i row_4x32b;
  __m128i intra_pred_ang_4x32b;
  __m128i fract_4x32b;
  __m128i const_temp4_4x32b;
  __m128i const_temp3_4x32b;
  __m128i const_temp2_4x32b;
  __m128i const_temp_4x32b;
  WORD32 intra_pred_ang;
  WORD32 two_nt;
  WORD32 col;
  WORD32 row;
  undefined8 local_1e98;
  undefined8 uStack_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  undefined8 uStack_1e70;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined4 local_1e58;
  undefined2 uStack_1e54;
  undefined2 uStack_1e52;
  undefined4 uStack_1e50;
  undefined2 uStack_1e4c;
  undefined2 uStack_1e4a;
  undefined4 local_1e48;
  undefined2 uStack_1e44;
  undefined2 uStack_1e42;
  undefined4 uStack_1e40;
  undefined2 uStack_1e3c;
  undefined2 uStack_1e3a;
  undefined2 uStack_1e30;
  char cStack_1e2e;
  char cStack_1e2d;
  char cStack_1e2c;
  char cStack_1e2b;
  char cStack_1e2a;
  char cStack_1e29;
  undefined2 uStack_1e20;
  char cStack_1e1e;
  char cStack_1e1d;
  char cStack_1e1c;
  char cStack_1e1b;
  char cStack_1e1a;
  char cStack_1e19;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined4 local_1d58;
  undefined4 uStack_1d54;
  undefined4 uStack_1d50;
  undefined4 uStack_1d4c;
  ulong local_1d48;
  ulong uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  ulong local_1d28;
  ulong uStack_1d20;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined4 local_1c88;
  undefined2 uStack_1c84;
  undefined2 uStack_1c82;
  undefined4 uStack_1c80;
  undefined2 uStack_1c7c;
  undefined2 uStack_1c7a;
  undefined4 local_1c78;
  undefined2 uStack_1c74;
  undefined2 uStack_1c72;
  undefined4 uStack_1c70;
  undefined2 uStack_1c6c;
  undefined2 uStack_1c6a;
  undefined2 uStack_1c60;
  char cStack_1c5e;
  char cStack_1c5d;
  char cStack_1c5c;
  char cStack_1c5b;
  char cStack_1c5a;
  char cStack_1c59;
  undefined2 uStack_1c50;
  char cStack_1c4e;
  char cStack_1c4d;
  char cStack_1c4c;
  char cStack_1c4b;
  char cStack_1c4a;
  char cStack_1c49;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined4 local_1b88;
  undefined4 uStack_1b84;
  undefined4 uStack_1b80;
  undefined4 uStack_1b7c;
  ulong local_1b78;
  ulong uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  ulong local_1b58;
  ulong uStack_1b50;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a58;
  ulong uStack_1a50;
  undefined8 local_1a48;
  ulong uStack_1a40;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined4 uStack_19b4;
  undefined4 uStack_19b0;
  undefined4 uStack_19ac;
  short local_195c;
  short local_1958;
  int local_1954;
  int local_1950;
  short local_17a8;
  short sStack_17a6;
  short sStack_17a4;
  short sStack_17a2;
  short sStack_17a0;
  short sStack_179e;
  short sStack_179c;
  short sStack_179a;
  short local_1788;
  short sStack_1786;
  short sStack_1784;
  short sStack_1782;
  short sStack_1780;
  short sStack_177e;
  short sStack_177c;
  short sStack_177a;
  short local_1768;
  short sStack_1766;
  short sStack_1764;
  short sStack_1762;
  short sStack_1760;
  short sStack_175e;
  short sStack_175c;
  short sStack_175a;
  short local_1748;
  short sStack_1746;
  short sStack_1744;
  short sStack_1742;
  short sStack_1740;
  short sStack_173e;
  short sStack_173c;
  short sStack_173a;
  short local_1728;
  short sStack_1726;
  short sStack_1724;
  short sStack_1722;
  short sStack_1720;
  short sStack_171e;
  short sStack_171c;
  short sStack_171a;
  short local_1708;
  short sStack_1706;
  short sStack_1704;
  short sStack_1702;
  short sStack_1700;
  short sStack_16fe;
  short sStack_16fc;
  short sStack_16fa;
  short local_16e8;
  short sStack_16e6;
  short sStack_16e4;
  short sStack_16e2;
  short sStack_16e0;
  short sStack_16de;
  short sStack_16dc;
  short sStack_16da;
  short local_16c8;
  short sStack_16c6;
  short sStack_16c4;
  short sStack_16c2;
  short sStack_16c0;
  short sStack_16be;
  short sStack_16bc;
  short sStack_16ba;
  short local_16a8;
  short sStack_16a6;
  short sStack_16a4;
  short sStack_16a2;
  short sStack_16a0;
  short sStack_169e;
  short sStack_169c;
  short sStack_169a;
  short local_1688;
  short sStack_1686;
  short sStack_1684;
  short sStack_1682;
  short sStack_1680;
  short sStack_167e;
  short sStack_167c;
  short sStack_167a;
  short local_1668;
  short sStack_1666;
  short sStack_1664;
  short sStack_1662;
  short sStack_1660;
  short sStack_165e;
  short sStack_165c;
  short sStack_165a;
  short local_1648;
  short sStack_1646;
  short sStack_1644;
  short sStack_1642;
  short sStack_1640;
  short sStack_163e;
  short sStack_163c;
  short sStack_163a;
  short local_1628;
  short sStack_1626;
  short sStack_1624;
  short sStack_1622;
  short sStack_1620;
  short sStack_161e;
  short sStack_161c;
  short sStack_161a;
  short local_1608;
  short sStack_1606;
  short sStack_1604;
  short sStack_1602;
  short sStack_1600;
  short sStack_15fe;
  short sStack_15fc;
  short sStack_15fa;
  short local_15e8;
  short sStack_15e6;
  short sStack_15e4;
  short sStack_15e2;
  short sStack_15e0;
  short sStack_15de;
  short sStack_15dc;
  short sStack_15da;
  short local_15c8;
  short sStack_15c6;
  short sStack_15c4;
  short sStack_15c2;
  short sStack_15c0;
  short sStack_15be;
  short sStack_15bc;
  short sStack_15ba;
  short local_1588;
  short sStack_1586;
  short sStack_1584;
  short sStack_1582;
  short sStack_1580;
  short sStack_157e;
  short sStack_157c;
  short sStack_157a;
  short local_1568;
  short sStack_1566;
  short sStack_1564;
  short sStack_1562;
  short sStack_1560;
  short sStack_155e;
  short sStack_155c;
  short sStack_155a;
  short local_1548;
  short sStack_1546;
  short sStack_1544;
  short sStack_1542;
  short sStack_1540;
  short sStack_153e;
  short sStack_153c;
  short sStack_153a;
  short local_1528;
  short sStack_1526;
  short sStack_1524;
  short sStack_1522;
  short sStack_1520;
  short sStack_151e;
  short sStack_151c;
  short sStack_151a;
  short local_1258;
  short sStack_1256;
  short sStack_1254;
  short sStack_1252;
  short sStack_1250;
  short sStack_124e;
  short sStack_124c;
  short sStack_124a;
  short local_1248;
  short sStack_1246;
  short sStack_1244;
  short sStack_1242;
  short sStack_1240;
  short sStack_123e;
  short sStack_123c;
  short sStack_123a;
  short local_1238;
  short sStack_1236;
  short sStack_1234;
  short sStack_1232;
  short sStack_1230;
  short sStack_122e;
  short sStack_122c;
  short sStack_122a;
  short local_1228;
  short sStack_1226;
  short sStack_1224;
  short sStack_1222;
  short sStack_1220;
  short sStack_121e;
  short sStack_121c;
  short sStack_121a;
  short local_1218;
  short sStack_1216;
  short sStack_1214;
  short sStack_1212;
  short sStack_1210;
  short sStack_120e;
  short sStack_120c;
  short sStack_120a;
  short local_1208;
  short sStack_1206;
  short sStack_1204;
  short sStack_1202;
  short sStack_1200;
  short sStack_11fe;
  short sStack_11fc;
  short sStack_11fa;
  short local_11f8;
  short sStack_11f6;
  short sStack_11f4;
  short sStack_11f2;
  short sStack_11f0;
  short sStack_11ee;
  short sStack_11ec;
  short sStack_11ea;
  short local_11e8;
  short sStack_11e6;
  short sStack_11e4;
  short sStack_11e2;
  short sStack_11e0;
  short sStack_11de;
  short sStack_11dc;
  short sStack_11da;
  short local_11d8;
  short sStack_11d6;
  short sStack_11d4;
  short sStack_11d2;
  short sStack_11d0;
  short sStack_11ce;
  short sStack_11cc;
  short sStack_11ca;
  short local_11c8;
  short sStack_11c6;
  short sStack_11c4;
  short sStack_11c2;
  short sStack_11c0;
  short sStack_11be;
  short sStack_11bc;
  short sStack_11ba;
  short local_11b8;
  short sStack_11b6;
  short sStack_11b4;
  short sStack_11b2;
  short sStack_11b0;
  short sStack_11ae;
  short sStack_11ac;
  short sStack_11aa;
  short local_11a8;
  short sStack_11a6;
  short sStack_11a4;
  short sStack_11a2;
  short sStack_11a0;
  short sStack_119e;
  short sStack_119c;
  short sStack_119a;
  short local_1198;
  short sStack_1196;
  short sStack_1194;
  short sStack_1192;
  short sStack_1190;
  short sStack_118e;
  short sStack_118c;
  short sStack_118a;
  short local_1188;
  short sStack_1186;
  short sStack_1184;
  short sStack_1182;
  short sStack_1180;
  short sStack_117e;
  short sStack_117c;
  short sStack_117a;
  short local_1178;
  short sStack_1176;
  short sStack_1174;
  short sStack_1172;
  short sStack_1170;
  short sStack_116e;
  short sStack_116c;
  short sStack_116a;
  short local_1168;
  short sStack_1166;
  short sStack_1164;
  short sStack_1162;
  short sStack_1160;
  short sStack_115e;
  short sStack_115c;
  short sStack_115a;
  short local_1158;
  short sStack_1156;
  short sStack_1154;
  short sStack_1152;
  short local_1148;
  short sStack_1146;
  short sStack_1144;
  short sStack_1142;
  short local_1138;
  short sStack_1136;
  short sStack_1134;
  short sStack_1132;
  short local_1128;
  short sStack_1126;
  short sStack_1124;
  short sStack_1122;
  undefined4 local_e58;
  undefined4 local_e38;
  short local_b78;
  short sStack_b76;
  short sStack_b74;
  short sStack_b72;
  short sStack_b70;
  short sStack_b6e;
  short sStack_b6c;
  short sStack_b6a;
  short local_b58;
  short sStack_b56;
  short sStack_b54;
  short sStack_b52;
  short sStack_b50;
  short sStack_b4e;
  short sStack_b4c;
  short sStack_b4a;
  short local_b38;
  short sStack_b36;
  short sStack_b34;
  short sStack_b32;
  short sStack_b30;
  short sStack_b2e;
  short sStack_b2c;
  short sStack_b2a;
  short local_b18;
  short sStack_b16;
  short sStack_b14;
  short sStack_b12;
  short sStack_b10;
  short sStack_b0e;
  short sStack_b0c;
  short sStack_b0a;
  int local_9a8;
  int iStack_9a4;
  int iStack_9a0;
  int iStack_99c;
  int local_958;
  int iStack_954;
  int iStack_950;
  undefined1 uStack_840;
  undefined1 uStack_83f;
  undefined1 uStack_83e;
  undefined1 uStack_83d;
  undefined1 uStack_83c;
  undefined1 uStack_83b;
  undefined1 uStack_83a;
  undefined1 uStack_839;
  undefined1 uStack_830;
  undefined1 uStack_82f;
  undefined1 uStack_82e;
  undefined1 uStack_82d;
  undefined1 uStack_82c;
  undefined1 uStack_82b;
  undefined1 uStack_82a;
  undefined1 uStack_829;
  undefined1 uStack_7e0;
  undefined1 uStack_7df;
  undefined1 uStack_7de;
  undefined1 uStack_7dd;
  undefined1 uStack_7dc;
  undefined1 uStack_7db;
  undefined1 uStack_7da;
  undefined1 uStack_7d9;
  undefined1 uStack_7d0;
  undefined1 uStack_7cf;
  undefined1 uStack_7ce;
  undefined1 uStack_7cd;
  undefined1 uStack_7cc;
  undefined1 uStack_7cb;
  undefined1 uStack_7ca;
  undefined1 uStack_7c9;
  undefined1 uStack_7a0;
  undefined1 uStack_79f;
  undefined1 uStack_79c;
  undefined1 uStack_79b;
  undefined1 uStack_790;
  undefined1 uStack_78f;
  undefined1 uStack_78c;
  undefined1 uStack_78b;
  undefined1 local_748;
  undefined1 uStack_747;
  undefined1 uStack_746;
  undefined1 uStack_745;
  undefined1 uStack_744;
  undefined1 uStack_743;
  undefined1 uStack_742;
  undefined1 uStack_741;
  undefined1 uStack_737;
  undefined1 uStack_736;
  undefined1 uStack_735;
  undefined1 uStack_734;
  undefined1 uStack_733;
  undefined1 uStack_732;
  undefined1 uStack_731;
  undefined1 local_6e8;
  undefined1 uStack_6e7;
  undefined1 uStack_6e6;
  undefined1 uStack_6e5;
  undefined1 uStack_6e4;
  undefined1 uStack_6e3;
  undefined1 uStack_6e2;
  undefined1 uStack_6e1;
  undefined1 uStack_6d7;
  undefined1 uStack_6d6;
  undefined1 uStack_6d5;
  undefined1 uStack_6d4;
  undefined1 uStack_6d3;
  undefined1 uStack_6d2;
  undefined1 uStack_6d1;
  undefined1 local_6a8;
  undefined1 uStack_6a7;
  undefined1 uStack_6a4;
  undefined1 uStack_6a3;
  undefined1 local_698;
  undefined1 uStack_697;
  undefined1 uStack_694;
  undefined1 uStack_693;
  undefined2 uStack_406;
  undefined2 uStack_404;
  undefined2 uStack_402;
  undefined2 uStack_3f6;
  undefined2 uStack_3f4;
  undefined2 uStack_3f2;
  undefined2 uStack_3e6;
  undefined2 uStack_3e4;
  undefined2 uStack_3e2;
  undefined2 uStack_3d6;
  undefined2 uStack_3d4;
  undefined2 uStack_3d2;
  undefined2 uStack_3c6;
  undefined2 uStack_3c4;
  undefined2 uStack_3c2;
  undefined2 uStack_3b6;
  undefined2 uStack_3b4;
  undefined2 uStack_3b2;
  undefined2 uStack_3a6;
  undefined2 uStack_3a4;
  undefined2 uStack_3a2;
  undefined2 uStack_396;
  undefined2 uStack_394;
  undefined2 uStack_392;
  undefined2 uStack_386;
  undefined2 uStack_384;
  undefined2 uStack_382;
  undefined2 uStack_376;
  undefined2 uStack_374;
  undefined2 uStack_372;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  undefined2 uStack_17e;
  undefined2 uStack_17c;
  undefined2 uStack_17a;
  undefined2 uStack_16e;
  undefined2 uStack_16c;
  undefined2 uStack_16a;
  undefined2 uStack_15e;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  undefined2 uStack_14e;
  undefined2 uStack_14c;
  undefined2 uStack_14a;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined4 uStack_104;
  undefined4 uStack_f4;
  undefined4 uStack_e4;
  undefined4 uStack_d4;
  undefined4 uStack_c4;
  undefined4 uStack_b4;
  undefined4 uStack_a4;
  undefined4 uStack_94;
  undefined4 uStack_7c;
  undefined4 uStack_6c;
  __m128i src_temp18_8x16b_1;
  __m128i src_temp17_8x16b_1;
  __m128i src_temp16_8x16b_1;
  __m128i src_temp15_8x16b_1;
  __m128i src_temp14_8x16b_1;
  __m128i src_temp13_8x16b_1;
  
  sVar73 = (short)in_R8D;
  local_1958 = sVar73 * 2;
  WVar1 = gai4_ihevc_ang_table[in_R9D];
  auVar75._4_4_ = WVar1;
  auVar75._0_4_ = WVar1;
  auVar75._12_4_ = WVar1;
  auVar75._8_4_ = WVar1;
  if (in_R8D == 4) {
    auVar52._8_8_ = 0x400000003;
    auVar52._0_8_ = 0x200000001;
    auVar75 = pmulld(auVar52,auVar75);
    local_1a08 = auVar75._0_8_;
    uStack_1a00 = auVar75._8_8_;
    local_1a08 = local_1a08 & 0x1f0000001f;
    uStack_1a00 = uStack_1a00 & 0x1f0000001f;
    local_958 = auVar75._0_4_;
    iStack_954 = auVar75._4_4_;
    iStack_950 = auVar75._8_4_;
    auVar83 = ZEXT416(5);
    local_9a8 = (int)local_1a08;
    iStack_9a4 = (int)(local_1a08 >> 0x20);
    iStack_9a0 = (int)uStack_1a00;
    iStack_99c = (int)(uStack_1a00 >> 0x20);
    local_19d8 = CONCAT44(0x20 - iStack_9a4,0x20 - local_9a8);
    uStack_19d0 = CONCAT44(0x20 - iStack_99c,0x20 - iStack_9a0);
    auVar14._8_8_ = uStack_1a00;
    auVar14._0_8_ = local_1a08;
    auVar75 = psllw(auVar14,ZEXT416(8));
    auVar13._8_8_ = uStack_19d0;
    auVar13._0_8_ = local_19d8;
    auVar76 = psllw(auVar13,ZEXT416(8));
    local_1a48 = auVar75._0_8_;
    uStack_1a40 = auVar75._8_8_;
    local_1a58 = auVar76._0_8_;
    uStack_1a50 = auVar76._8_8_;
    local_19d8 = local_19d8 | local_1a58;
    uStack_19d0 = uStack_19d0 | uStack_1a50;
    uStack_790 = (undefined1)uStack_19d0;
    uStack_78f = (undefined1)(uStack_19d0 >> 8);
    uStack_78c = (undefined1)(uStack_19d0 >> 0x20);
    uStack_78b = (undefined1)(uStack_19d0 >> 0x28);
    uStack_7a0 = (undefined1)(uStack_1a00 | uStack_1a40);
    uStack_79f = auVar75[9];
    uStack_79c = (undefined1)((uStack_1a00 | uStack_1a40) >> 0x20);
    uStack_79b = auVar75[0xd];
    local_1a58._0_4_ = CONCAT13(uStack_79f,CONCAT12(uStack_78f,CONCAT11(uStack_7a0,uStack_790)));
    uVar2 = CONCAT13(uStack_79b,CONCAT12(uStack_78b,CONCAT11(uStack_79c,uStack_78c)));
    local_698 = (undefined1)local_19d8;
    uStack_697 = (undefined1)(local_19d8 >> 8);
    uStack_694 = (undefined1)(local_19d8 >> 0x20);
    uStack_693 = (undefined1)(local_19d8 >> 0x28);
    local_6a8 = (undefined1)(local_1a08 | local_1a48);
    uStack_6a7 = auVar75[1];
    uStack_6a4 = (undefined1)((local_1a08 | local_1a48) >> 0x20);
    uStack_6a3 = auVar75[5];
    local_1a48._0_4_ = CONCAT13(uStack_6a7,CONCAT12(uStack_697,CONCAT11(local_6a8,local_698)));
    uVar7 = CONCAT13(uStack_6a3,CONCAT12(uStack_693,CONCAT11(uStack_6a4,uStack_694)));
    auVar51[8] = '\x05';
    auVar51[9] = '\x04';
    auVar51[10] = '\x06';
    auVar51[0xb] = '\x05';
    auVar51[0xc] = '\a';
    auVar51[0xd] = '\x06';
    auVar51[0xe] = '\b';
    auVar51[0xf] = '\a';
    auVar51[0] = '\x01';
    auVar51[1] = '\0';
    auVar51[2] = '\x02';
    auVar51[3] = '\x01';
    auVar51[4] = '\x03';
    auVar51[5] = '\x02';
    auVar51[6] = '\x04';
    auVar51[7] = '\x03';
    auVar75 = pshufb(*(undefined1 (*) [16])(in_RDI + -1 + (long)(4 - (local_958 >> auVar83))),
                     auVar51);
    auVar50[8] = '\x05';
    auVar50[9] = '\x04';
    auVar50[10] = '\x06';
    auVar50[0xb] = '\x05';
    auVar50[0xc] = '\a';
    auVar50[0xd] = '\x06';
    auVar50[0xe] = '\b';
    auVar50[0xf] = '\a';
    auVar50[0] = '\x01';
    auVar50[1] = '\0';
    auVar50[2] = '\x02';
    auVar50[3] = '\x01';
    auVar50[4] = '\x03';
    auVar50[5] = '\x02';
    auVar50[6] = '\x04';
    auVar50[7] = '\x03';
    auVar76 = pshufb(*(undefined1 (*) [16])(in_RDI + -1 + (long)(4 - (iStack_954 >> auVar83))),
                     auVar50);
    auVar49[8] = '\x05';
    auVar49[9] = '\x04';
    auVar49[10] = '\x06';
    auVar49[0xb] = '\x05';
    auVar49[0xc] = '\a';
    auVar49[0xd] = '\x06';
    auVar49[0xe] = '\b';
    auVar49[0xf] = '\a';
    auVar49[0] = '\x01';
    auVar49[1] = '\0';
    auVar49[2] = '\x02';
    auVar49[3] = '\x01';
    auVar49[4] = '\x03';
    auVar49[5] = '\x02';
    auVar49[6] = '\x04';
    auVar49[7] = '\x03';
    auVar83 = pshufb(*(undefined1 (*) [16])(in_RDI + -1 + (long)(4 - (iStack_950 >> auVar83))),
                     auVar49);
    auVar48[8] = '\x05';
    auVar48[9] = '\x04';
    auVar48[10] = '\x06';
    auVar48[0xb] = '\x05';
    auVar48[0xc] = '\a';
    auVar48[0xd] = '\x06';
    auVar48[0xe] = '\b';
    auVar48[0xf] = '\a';
    auVar48[0] = '\x01';
    auVar48[1] = '\0';
    auVar48[2] = '\x02';
    auVar48[3] = '\x01';
    auVar48[4] = '\x03';
    auVar48[5] = '\x02';
    auVar48[6] = '\x04';
    auVar48[7] = '\x03';
    auVar77 = pshufb(*(undefined1 (*) [16])(in_RDI + -1),auVar48);
    auVar72._4_4_ = (undefined4)local_1a48;
    auVar72._0_4_ = (undefined4)local_1a48;
    auVar72._12_4_ = (undefined4)local_1a48;
    auVar72._8_4_ = (undefined4)local_1a48;
    auVar75 = pmaddubsw(auVar75,auVar72);
    auVar71._4_4_ = uVar7;
    auVar71._0_4_ = uVar7;
    auVar71._12_4_ = uVar7;
    auVar71._8_4_ = uVar7;
    auVar76 = pmaddubsw(auVar76,auVar71);
    auVar70._4_4_ = (undefined4)local_1a58;
    auVar70._0_4_ = (undefined4)local_1a58;
    auVar70._12_4_ = (undefined4)local_1a58;
    auVar70._8_4_ = (undefined4)local_1a58;
    auVar83 = pmaddubsw(auVar83,auVar70);
    auVar69._4_4_ = uVar2;
    auVar69._0_4_ = uVar2;
    auVar69._12_4_ = uVar2;
    auVar69._8_4_ = uVar2;
    auVar77 = pmaddubsw(auVar77,auVar69);
    local_1528 = auVar75._0_2_;
    sStack_1526 = auVar75._2_2_;
    sStack_1524 = auVar75._4_2_;
    sStack_1522 = auVar75._6_2_;
    sStack_1520 = auVar75._8_2_;
    sStack_151e = auVar75._10_2_;
    sStack_151c = auVar75._12_2_;
    sStack_151a = auVar75._14_2_;
    local_1aa8._0_4_ = CONCAT22(sStack_1526 + 0x10,local_1528 + 0x10);
    local_1aa8._0_6_ = CONCAT24(sStack_1524 + 0x10,(undefined4)local_1aa8);
    local_1aa8 = CONCAT26(sStack_1522 + 0x10,(undefined6)local_1aa8);
    uStack_1aa0._0_2_ = sStack_1520 + 0x10;
    uStack_1aa0._2_2_ = sStack_151e + 0x10;
    uStack_1aa0._4_2_ = sStack_151c + 0x10;
    uStack_1aa0._6_2_ = sStack_151a + 0x10;
    local_1548 = auVar76._0_2_;
    sStack_1546 = auVar76._2_2_;
    sStack_1544 = auVar76._4_2_;
    sStack_1542 = auVar76._6_2_;
    sStack_1540 = auVar76._8_2_;
    sStack_153e = auVar76._10_2_;
    sStack_153c = auVar76._12_2_;
    sStack_153a = auVar76._14_2_;
    local_1ab8._0_4_ = CONCAT22(sStack_1546 + 0x10,local_1548 + 0x10);
    local_1ab8._0_6_ = CONCAT24(sStack_1544 + 0x10,(undefined4)local_1ab8);
    local_1ab8 = CONCAT26(sStack_1542 + 0x10,(undefined6)local_1ab8);
    uStack_1ab0._0_2_ = sStack_1540 + 0x10;
    uStack_1ab0._2_2_ = sStack_153e + 0x10;
    uStack_1ab0._4_2_ = sStack_153c + 0x10;
    uStack_1ab0._6_2_ = sStack_153a + 0x10;
    local_1568 = auVar83._0_2_;
    sStack_1566 = auVar83._2_2_;
    sStack_1564 = auVar83._4_2_;
    sStack_1562 = auVar83._6_2_;
    sStack_1560 = auVar83._8_2_;
    sStack_155e = auVar83._10_2_;
    sStack_155c = auVar83._12_2_;
    sStack_155a = auVar83._14_2_;
    local_1ac8._0_4_ = CONCAT22(sStack_1566 + 0x10,local_1568 + 0x10);
    local_1ac8._0_6_ = CONCAT24(sStack_1564 + 0x10,(undefined4)local_1ac8);
    local_1ac8 = CONCAT26(sStack_1562 + 0x10,(undefined6)local_1ac8);
    uStack_1ac0._0_2_ = sStack_1560 + 0x10;
    uStack_1ac0._2_2_ = sStack_155e + 0x10;
    uStack_1ac0._4_2_ = sStack_155c + 0x10;
    uStack_1ac0._6_2_ = sStack_155a + 0x10;
    local_1588 = auVar77._0_2_;
    sStack_1586 = auVar77._2_2_;
    sStack_1584 = auVar77._4_2_;
    sStack_1582 = auVar77._6_2_;
    sStack_1580 = auVar77._8_2_;
    sStack_157e = auVar77._10_2_;
    sStack_157c = auVar77._12_2_;
    sStack_157a = auVar77._14_2_;
    local_1ad8._0_4_ = CONCAT22(sStack_1586 + 0x10,local_1588 + 0x10);
    local_1ad8._0_6_ = CONCAT24(sStack_1584 + 0x10,(undefined4)local_1ad8);
    local_1ad8 = CONCAT26(sStack_1582 + 0x10,(undefined6)local_1ad8);
    uStack_1ad0._0_2_ = sStack_1580 + 0x10;
    uStack_1ad0._2_2_ = sStack_157e + 0x10;
    uStack_1ad0._4_2_ = sStack_157c + 0x10;
    uStack_1ad0._6_2_ = sStack_157a + 0x10;
    auVar31._8_8_ = uStack_1aa0;
    auVar31._0_8_ = local_1aa8;
    auVar75 = psraw(auVar31,ZEXT416(5));
    auVar30._8_8_ = uStack_1ab0;
    auVar30._0_8_ = local_1ab8;
    auVar76 = psraw(auVar30,ZEXT416(5));
    auVar29._8_8_ = uStack_1ac0;
    auVar29._0_8_ = local_1ac8;
    auVar83 = psraw(auVar29,ZEXT416(5));
    auVar28._8_8_ = uStack_1ad0;
    auVar28._0_8_ = local_1ad8;
    auVar77 = psraw(auVar28,ZEXT416(5));
    local_1128 = auVar75._0_2_;
    sStack_1126 = auVar75._2_2_;
    sStack_1124 = auVar75._4_2_;
    sStack_1122 = auVar75._6_2_;
    local_1138 = auVar83._0_2_;
    sStack_1136 = auVar83._2_2_;
    sStack_1134 = auVar83._4_2_;
    sStack_1132 = auVar83._6_2_;
    local_1148 = auVar76._0_2_;
    sStack_1146 = auVar76._2_2_;
    sStack_1144 = auVar76._4_2_;
    sStack_1142 = auVar76._6_2_;
    local_1158 = auVar77._0_2_;
    sStack_1156 = auVar77._2_2_;
    sStack_1154 = auVar77._4_2_;
    sStack_1152 = auVar77._6_2_;
    uVar5 = CONCAT11((0 < local_1148) * (local_1148 < 0x100) * auVar76[0] - (0xff < local_1148),
                     (0 < local_1128) * (local_1128 < 0x100) * auVar75[0] - (0xff < local_1128));
    uVar7 = CONCAT13((0 < sStack_1146) * (sStack_1146 < 0x100) * auVar76[2] - (0xff < sStack_1146),
                     CONCAT12((0 < sStack_1126) * (sStack_1126 < 0x100) * auVar75[2] -
                              (0xff < sStack_1126),uVar5));
    uVar8 = CONCAT15((0 < sStack_1144) * (sStack_1144 < 0x100) * auVar76[4] - (0xff < sStack_1144),
                     CONCAT14((0 < sStack_1124) * (sStack_1124 < 0x100) * auVar75[4] -
                              (0xff < sStack_1124),uVar7));
    uVar3 = CONCAT11((0 < local_1158) * (local_1158 < 0x100) * auVar77[0] - (0xff < local_1158),
                     (0 < local_1138) * (local_1138 < 0x100) * auVar83[0] - (0xff < local_1138));
    uVar2 = CONCAT13((0 < sStack_1156) * (sStack_1156 < 0x100) * auVar77[2] - (0xff < sStack_1156),
                     CONCAT12((0 < sStack_1136) * (sStack_1136 < 0x100) * auVar83[2] -
                              (0xff < sStack_1136),uVar3));
    uVar4 = CONCAT15((0 < sStack_1154) * (sStack_1154 < 0x100) * auVar77[4] - (0xff < sStack_1154),
                     CONCAT14((0 < sStack_1134) * (sStack_1134 < 0x100) * auVar83[4] -
                              (0xff < sStack_1134),uVar2));
    uStack_376 = (undefined2)((uint)uVar7 >> 0x10);
    uStack_374 = (undefined2)((uint6)uVar8 >> 0x20);
    uStack_372 = (undefined2)
                 (CONCAT17((0 < sStack_1142) * (sStack_1142 < 0x100) * auVar76[6] -
                           (0xff < sStack_1142),
                           CONCAT16((0 < sStack_1122) * (sStack_1122 < 0x100) * auVar75[6] -
                                    (0xff < sStack_1122),uVar8)) >> 0x30);
    uStack_386 = (undefined2)((uint)uVar2 >> 0x10);
    uStack_384 = (undefined2)((uint6)uVar4 >> 0x20);
    uStack_382 = (undefined2)
                 (CONCAT17((0 < sStack_1152) * (sStack_1152 < 0x100) * auVar77[6] -
                           (0xff < sStack_1152),
                           CONCAT16((0 < sStack_1132) * (sStack_1132 < 0x100) * auVar83[6] -
                                    (0xff < sStack_1132),uVar4)) >> 0x30);
    local_1ac8._0_4_ = CONCAT22(uVar3,uVar5);
    local_1ac8._0_6_ = CONCAT24(uStack_376,(undefined4)local_1ac8);
    local_1ac8 = CONCAT26(uStack_386,(undefined6)local_1ac8);
    uStack_1ac0._0_2_ = uStack_374;
    uStack_1ac0._2_2_ = uStack_384;
    uStack_1ac0._4_2_ = uStack_372;
    uStack_1ac0._6_2_ = uStack_382;
    local_e38 = local_1ac8._8_4_;
    local_e58 = (undefined4)((ulong)local_1ac8 >> 0x20);
    *(int *)in_RDX = local_1ac8._12_4_;
    *(undefined4 *)((long)in_RDX + (long)in_ECX) = local_e38;
    *(undefined4 *)((long)in_RDX + (long)(in_ECX << 1)) = local_e58;
    *(undefined4 *)((long)in_RDX + (long)(in_ECX * 3)) = (undefined4)local_1ac8;
  }
  else {
    local_195c = (short)WVar1;
    if ((in_R8D == 0x10) || (in_R8D == 0x20)) {
      local_19d8 = 0x4000300020001;
      uStack_19d0 = 0x8000700060005;
      for (local_1954 = 0; local_1954 < in_R8D; local_1954 = local_1954 + 8) {
        local_198 = (short)local_19d8;
        sStack_196 = (short)(local_19d8 >> 0x10);
        sStack_194 = (short)(local_19d8 >> 0x20);
        sStack_192 = (short)(local_19d8 >> 0x30);
        sStack_190 = (short)uStack_19d0;
        sStack_18e = (short)(uStack_19d0 >> 0x10);
        sStack_18c = (short)(uStack_19d0 >> 0x20);
        sStack_18a = (short)(uStack_19d0 >> 0x30);
        local_1a08._0_4_ = CONCAT22(sStack_196 * local_195c,local_198 * local_195c);
        local_1a08._0_6_ = CONCAT24(sStack_194 * local_195c,(undefined4)local_1a08);
        local_1a08 = CONCAT26(sStack_192 * local_195c,(undefined6)local_1a08);
        uStack_1a00._0_2_ = sStack_190 * local_195c;
        uStack_1a00._2_2_ = sStack_18e * local_195c;
        uStack_1a00._4_2_ = sStack_18c * local_195c;
        uStack_1a00._6_2_ = sStack_18a * local_195c;
        uVar74 = local_1a08 & 0x1f001f001f001f;
        uVar82 = uStack_1a00 & 0x1f001f001f001f;
        local_b18 = (short)uVar74;
        sStack_b16 = (short)(uVar74 >> 0x10);
        sStack_b14 = (short)(uVar74 >> 0x20);
        sStack_b12 = (short)(uVar74 >> 0x30);
        sStack_b10 = (short)uVar82;
        sStack_b0e = (short)(uVar82 >> 0x10);
        sStack_b0c = (short)(uVar82 >> 0x20);
        sStack_b0a = (short)(uVar82 >> 0x30);
        local_1b68 = CONCAT26(0x20 - sStack_b12,
                              CONCAT24(0x20 - sStack_b14,
                                       CONCAT22(0x20 - sStack_b16,0x20 - local_b18)));
        uStack_1b60 = CONCAT26(0x20 - sStack_b0a,
                               CONCAT24(0x20 - sStack_b0c,
                                        CONCAT22(0x20 - sStack_b0e,0x20 - sStack_b10)));
        auVar83._8_8_ = uVar82;
        auVar83._0_8_ = uVar74;
        auVar75 = psllw(auVar83,ZEXT416(8));
        auVar76._8_8_ = uStack_1b60;
        auVar76._0_8_ = local_1b68;
        auVar76 = psllw(auVar76,ZEXT416(8));
        local_1b58 = auVar75._0_8_;
        uStack_1b50 = auVar75._8_8_;
        uVar74 = uVar74 | local_1b58;
        uVar82 = uVar82 | uStack_1b50;
        local_1b78 = auVar76._0_8_;
        uStack_1b70 = auVar76._8_8_;
        local_1b68 = local_1b68 | local_1b78;
        uStack_1b60 = uStack_1b60 | uStack_1b70;
        uStack_7d0 = (undefined1)uStack_1b60;
        uStack_7cf = (undefined1)(uStack_1b60 >> 8);
        uStack_7ce = (undefined1)(uStack_1b60 >> 0x10);
        uStack_7cd = (undefined1)(uStack_1b60 >> 0x18);
        uStack_7cc = (undefined1)(uStack_1b60 >> 0x20);
        uStack_7cb = (undefined1)(uStack_1b60 >> 0x28);
        uStack_7ca = (undefined1)(uStack_1b60 >> 0x30);
        uStack_7c9 = (undefined1)(uStack_1b60 >> 0x38);
        uStack_7e0 = (undefined1)uVar82;
        uStack_7df = auVar75[9];
        uStack_7de = (undefined1)(uVar82 >> 0x10);
        uStack_7dd = auVar75[0xb];
        uStack_7dc = (undefined1)(uVar82 >> 0x20);
        uStack_7db = auVar75[0xd];
        uStack_7da = (undefined1)(uVar82 >> 0x30);
        uStack_7d9 = auVar75[0xf];
        local_1b88 = CONCAT13(uStack_7df,CONCAT12(uStack_7cf,CONCAT11(uStack_7e0,uStack_7d0)));
        uStack_1b84 = CONCAT13(uStack_7dd,CONCAT12(uStack_7cd,CONCAT11(uStack_7de,uStack_7ce)));
        uStack_1b80 = CONCAT13(uStack_7db,CONCAT12(uStack_7cb,CONCAT11(uStack_7dc,uStack_7cc)));
        uStack_1b7c = CONCAT13(uStack_7d9,CONCAT12(uStack_7c9,CONCAT11(uStack_7da,uStack_7ca)));
        uStack_6d7 = (undefined1)(local_1b68 >> 8);
        uStack_6d6 = (undefined1)(local_1b68 >> 0x10);
        uStack_6d5 = (undefined1)(local_1b68 >> 0x18);
        uStack_6d4 = (undefined1)(local_1b68 >> 0x20);
        uStack_6d3 = (undefined1)(local_1b68 >> 0x28);
        uStack_6d2 = (undefined1)(local_1b68 >> 0x30);
        uStack_6d1 = (undefined1)(local_1b68 >> 0x38);
        local_6e8 = (undefined1)uVar74;
        uStack_6e7 = auVar75[1];
        uStack_6e6 = (undefined1)(uVar74 >> 0x10);
        uStack_6e5 = auVar75[3];
        uStack_6e4 = (undefined1)(uVar74 >> 0x20);
        uStack_6e3 = auVar75[5];
        uStack_6e2 = (undefined1)(uVar74 >> 0x30);
        uStack_6e1 = auVar75[7];
        uVar2 = CONCAT13(uStack_6e7,CONCAT12(uStack_6d7,CONCAT11(local_6e8,(char)local_1b68)));
        uStack_19b0._0_2_ = CONCAT11(uStack_6e4,uStack_6d4);
        uStack_19b0._0_3_ = CONCAT12(uStack_6d3,(undefined2)uStack_19b0);
        uStack_19b0 = CONCAT13(uStack_6e3,(undefined3)uStack_19b0);
        _uStack_19b0 = CONCAT14(uStack_6d2,uStack_19b0);
        _uStack_19b0 = CONCAT15(uStack_6e2,_uStack_19b0);
        _uStack_19b0 = CONCAT16(uStack_6d1,_uStack_19b0);
        _uStack_19b0 = CONCAT17(uStack_6e1,_uStack_19b0);
        uStack_19b4 = (undefined4)
                      (CONCAT17(uStack_6e5,
                                CONCAT16(uStack_6d5,CONCAT15(uStack_6e6,CONCAT14(uStack_6d6,uVar2)))
                               ) >> 0x20);
        auVar77._8_8_ = uStack_1a00;
        auVar77._0_8_ = local_1a08;
        auVar75 = psraw(auVar77,ZEXT416(5));
        local_b38 = auVar75._0_2_;
        sStack_b36 = auVar75._2_2_;
        sStack_b34 = auVar75._4_2_;
        sStack_b32 = auVar75._6_2_;
        sStack_b30 = auVar75._8_2_;
        sStack_b2e = auVar75._10_2_;
        sStack_b2c = auVar75._12_2_;
        sStack_b2a = auVar75._14_2_;
        local_19d8 = CONCAT26(sStack_192 + 8,
                              CONCAT24(sStack_194 + 8,CONCAT22(sStack_196 + 8,local_198 + 8)));
        uStack_19d0 = CONCAT26(sStack_18a + 8,
                               CONCAT24(sStack_18c + 8,CONCAT22(sStack_18e + 8,sStack_190 + 8)));
        for (local_1950 = 0; local_1950 < in_R8D; local_1950 = local_1950 + 8) {
          auVar47[8] = '\x05';
          auVar47[9] = '\x04';
          auVar47[10] = '\x06';
          auVar47[0xb] = '\x05';
          auVar47[0xc] = '\a';
          auVar47[0xd] = '\x06';
          auVar47[0xe] = '\b';
          auVar47[0xf] = '\a';
          auVar47[0] = '\x01';
          auVar47[1] = '\0';
          auVar47[2] = '\x02';
          auVar47[3] = '\x01';
          auVar47[4] = '\x03';
          auVar47[5] = '\x02';
          auVar47[6] = '\x04';
          auVar47[7] = '\x03';
          auVar75 = pshufb(*(undefined1 (*) [16])
                            (~(long)(local_1950 + 8) + in_RDI + (short)(local_1958 - local_b38)),
                           auVar47);
          auVar46[8] = '\x05';
          auVar46[9] = '\x04';
          auVar46[10] = '\x06';
          auVar46[0xb] = '\x05';
          auVar46[0xc] = '\a';
          auVar46[0xd] = '\x06';
          auVar46[0xe] = '\b';
          auVar46[0xf] = '\a';
          auVar46[0] = '\x01';
          auVar46[1] = '\0';
          auVar46[2] = '\x02';
          auVar46[3] = '\x01';
          auVar46[4] = '\x03';
          auVar46[5] = '\x02';
          auVar46[6] = '\x04';
          auVar46[7] = '\x03';
          auVar76 = pshufb(*(undefined1 (*) [16])
                            (~(long)(local_1950 + 8) + in_RDI + (short)(local_1958 - sStack_b36)),
                           auVar46);
          auVar45[8] = '\x05';
          auVar45[9] = '\x04';
          auVar45[10] = '\x06';
          auVar45[0xb] = '\x05';
          auVar45[0xc] = '\a';
          auVar45[0xd] = '\x06';
          auVar45[0xe] = '\b';
          auVar45[0xf] = '\a';
          auVar45[0] = '\x01';
          auVar45[1] = '\0';
          auVar45[2] = '\x02';
          auVar45[3] = '\x01';
          auVar45[4] = '\x03';
          auVar45[5] = '\x02';
          auVar45[6] = '\x04';
          auVar45[7] = '\x03';
          auVar83 = pshufb(*(undefined1 (*) [16])
                            (~(long)(local_1950 + 8) + in_RDI + (short)(local_1958 - sStack_b34)),
                           auVar45);
          auVar44[8] = '\x05';
          auVar44[9] = '\x04';
          auVar44[10] = '\x06';
          auVar44[0xb] = '\x05';
          auVar44[0xc] = '\a';
          auVar44[0xd] = '\x06';
          auVar44[0xe] = '\b';
          auVar44[0xf] = '\a';
          auVar44[0] = '\x01';
          auVar44[1] = '\0';
          auVar44[2] = '\x02';
          auVar44[3] = '\x01';
          auVar44[4] = '\x03';
          auVar44[5] = '\x02';
          auVar44[6] = '\x04';
          auVar44[7] = '\x03';
          auVar77 = pshufb(*(undefined1 (*) [16])
                            (~(long)(local_1950 + 8) + in_RDI + (short)(local_1958 - sStack_b32)),
                           auVar44);
          auVar43[8] = '\x05';
          auVar43[9] = '\x04';
          auVar43[10] = '\x06';
          auVar43[0xb] = '\x05';
          auVar43[0xc] = '\a';
          auVar43[0xd] = '\x06';
          auVar43[0xe] = '\b';
          auVar43[0xf] = '\a';
          auVar43[0] = '\x01';
          auVar43[1] = '\0';
          auVar43[2] = '\x02';
          auVar43[3] = '\x01';
          auVar43[4] = '\x03';
          auVar43[5] = '\x02';
          auVar43[6] = '\x04';
          auVar43[7] = '\x03';
          auVar78 = pshufb(*(undefined1 (*) [16])
                            (~(long)(local_1950 + 8) + in_RDI + (short)(local_1958 - sStack_b30)),
                           auVar43);
          auVar42[8] = '\x05';
          auVar42[9] = '\x04';
          auVar42[10] = '\x06';
          auVar42[0xb] = '\x05';
          auVar42[0xc] = '\a';
          auVar42[0xd] = '\x06';
          auVar42[0xe] = '\b';
          auVar42[0xf] = '\a';
          auVar42[0] = '\x01';
          auVar42[1] = '\0';
          auVar42[2] = '\x02';
          auVar42[3] = '\x01';
          auVar42[4] = '\x03';
          auVar42[5] = '\x02';
          auVar42[6] = '\x04';
          auVar42[7] = '\x03';
          auVar79 = pshufb(*(undefined1 (*) [16])
                            (~(long)(local_1950 + 8) + in_RDI + (short)(local_1958 - sStack_b2e)),
                           auVar42);
          auVar41[8] = '\x05';
          auVar41[9] = '\x04';
          auVar41[10] = '\x06';
          auVar41[0xb] = '\x05';
          auVar41[0xc] = '\a';
          auVar41[0xd] = '\x06';
          auVar41[0xe] = '\b';
          auVar41[0xf] = '\a';
          auVar41[0] = '\x01';
          auVar41[1] = '\0';
          auVar41[2] = '\x02';
          auVar41[3] = '\x01';
          auVar41[4] = '\x03';
          auVar41[5] = '\x02';
          auVar41[6] = '\x04';
          auVar41[7] = '\x03';
          auVar80 = pshufb(*(undefined1 (*) [16])
                            (~(long)(local_1950 + 8) + in_RDI + (short)(local_1958 - sStack_b2c)),
                           auVar41);
          auVar40[8] = '\x05';
          auVar40[9] = '\x04';
          auVar40[10] = '\x06';
          auVar40[0xb] = '\x05';
          auVar40[0xc] = '\a';
          auVar40[0xd] = '\x06';
          auVar40[0xe] = '\b';
          auVar40[0xf] = '\a';
          auVar40[0] = '\x01';
          auVar40[1] = '\0';
          auVar40[2] = '\x02';
          auVar40[3] = '\x01';
          auVar40[4] = '\x03';
          auVar40[5] = '\x02';
          auVar40[6] = '\x04';
          auVar40[7] = '\x03';
          auVar81 = pshufb(*(undefined1 (*) [16])
                            (~(long)(local_1950 + 8) + in_RDI + (short)(local_1958 - sStack_b2a)),
                           auVar40);
          auVar68._4_4_ = uVar2;
          auVar68._0_4_ = uVar2;
          auVar68._12_4_ = uVar2;
          auVar68._8_4_ = uVar2;
          auVar75 = pmaddubsw(auVar75,auVar68);
          auVar67._4_4_ = uStack_19b4;
          auVar67._0_4_ = uStack_19b4;
          auVar67._12_4_ = uStack_19b4;
          auVar67._8_4_ = uStack_19b4;
          auVar76 = pmaddubsw(auVar76,auVar67);
          auVar66._4_4_ = uStack_19b0;
          auVar66._0_4_ = uStack_19b0;
          auVar66._12_4_ = uStack_19b0;
          auVar66._8_4_ = uStack_19b0;
          auVar83 = pmaddubsw(auVar83,auVar66);
          auVar65._4_4_ = uStack_19ac;
          auVar65._0_4_ = uStack_19ac;
          auVar65._12_4_ = uStack_19ac;
          auVar65._8_4_ = uStack_19ac;
          auVar77 = pmaddubsw(auVar77,auVar65);
          auVar64._4_4_ = local_1b88;
          auVar64._0_4_ = local_1b88;
          auVar64._12_4_ = local_1b88;
          auVar64._8_4_ = local_1b88;
          auVar78 = pmaddubsw(auVar78,auVar64);
          auVar63._4_4_ = uStack_1b84;
          auVar63._0_4_ = uStack_1b84;
          auVar63._12_4_ = uStack_1b84;
          auVar63._8_4_ = uStack_1b84;
          auVar79 = pmaddubsw(auVar79,auVar63);
          auVar62._4_4_ = uStack_1b80;
          auVar62._0_4_ = uStack_1b80;
          auVar62._12_4_ = uStack_1b80;
          auVar62._8_4_ = uStack_1b80;
          auVar80 = pmaddubsw(auVar80,auVar62);
          auVar61._4_4_ = uStack_1b7c;
          auVar61._0_4_ = uStack_1b7c;
          auVar61._12_4_ = uStack_1b7c;
          auVar61._8_4_ = uStack_1b7c;
          auVar81 = pmaddubsw(auVar81,auVar61);
          local_15c8 = auVar75._0_2_;
          sStack_15c6 = auVar75._2_2_;
          sStack_15c4 = auVar75._4_2_;
          sStack_15c2 = auVar75._6_2_;
          sStack_15c0 = auVar75._8_2_;
          sStack_15be = auVar75._10_2_;
          sStack_15bc = auVar75._12_2_;
          sStack_15ba = auVar75._14_2_;
          local_1c18._0_4_ = CONCAT22(sStack_15c6 + 0x10,local_15c8 + 0x10);
          local_1c18._0_6_ = CONCAT24(sStack_15c4 + 0x10,(undefined4)local_1c18);
          local_1c18 = CONCAT26(sStack_15c2 + 0x10,(undefined6)local_1c18);
          uStack_1c10._0_2_ = sStack_15c0 + 0x10;
          uStack_1c10._2_2_ = sStack_15be + 0x10;
          uStack_1c10._4_2_ = sStack_15bc + 0x10;
          uStack_1c10._6_2_ = sStack_15ba + 0x10;
          local_15e8 = auVar76._0_2_;
          sStack_15e6 = auVar76._2_2_;
          sStack_15e4 = auVar76._4_2_;
          sStack_15e2 = auVar76._6_2_;
          sStack_15e0 = auVar76._8_2_;
          sStack_15de = auVar76._10_2_;
          sStack_15dc = auVar76._12_2_;
          sStack_15da = auVar76._14_2_;
          local_1c28._0_4_ = CONCAT22(sStack_15e6 + 0x10,local_15e8 + 0x10);
          local_1c28._0_6_ = CONCAT24(sStack_15e4 + 0x10,(undefined4)local_1c28);
          local_1c28 = CONCAT26(sStack_15e2 + 0x10,(undefined6)local_1c28);
          uStack_1c20._0_2_ = sStack_15e0 + 0x10;
          uStack_1c20._2_2_ = sStack_15de + 0x10;
          uStack_1c20._4_2_ = sStack_15dc + 0x10;
          uStack_1c20._6_2_ = sStack_15da + 0x10;
          local_1608 = auVar83._0_2_;
          sStack_1606 = auVar83._2_2_;
          sStack_1604 = auVar83._4_2_;
          sStack_1602 = auVar83._6_2_;
          sStack_1600 = auVar83._8_2_;
          sStack_15fe = auVar83._10_2_;
          sStack_15fc = auVar83._12_2_;
          sStack_15fa = auVar83._14_2_;
          local_1c38._0_4_ = CONCAT22(sStack_1606 + 0x10,local_1608 + 0x10);
          local_1c38._0_6_ = CONCAT24(sStack_1604 + 0x10,(undefined4)local_1c38);
          local_1c38 = CONCAT26(sStack_1602 + 0x10,(undefined6)local_1c38);
          uStack_1c30._0_2_ = sStack_1600 + 0x10;
          uStack_1c30._2_2_ = sStack_15fe + 0x10;
          uStack_1c30._4_2_ = sStack_15fc + 0x10;
          uStack_1c30._6_2_ = sStack_15fa + 0x10;
          local_1628 = auVar77._0_2_;
          sStack_1626 = auVar77._2_2_;
          sStack_1624 = auVar77._4_2_;
          sStack_1622 = auVar77._6_2_;
          sStack_1620 = auVar77._8_2_;
          sStack_161e = auVar77._10_2_;
          sStack_161c = auVar77._12_2_;
          sStack_161a = auVar77._14_2_;
          local_1c48._0_4_ = CONCAT22(sStack_1626 + 0x10,local_1628 + 0x10);
          local_1c48._0_6_ = CONCAT24(sStack_1624 + 0x10,(undefined4)local_1c48);
          local_1c48 = CONCAT26(sStack_1622 + 0x10,(undefined6)local_1c48);
          uStack_1c40._0_2_ = sStack_1620 + 0x10;
          uStack_1c40._2_2_ = sStack_161e + 0x10;
          uStack_1c40._4_2_ = sStack_161c + 0x10;
          uStack_1c40._6_2_ = sStack_161a + 0x10;
          auVar27._8_8_ = uStack_1c10;
          auVar27._0_8_ = local_1c18;
          auVar75 = psraw(auVar27,ZEXT416(5));
          auVar26._8_8_ = uStack_1c20;
          auVar26._0_8_ = local_1c28;
          auVar76 = psraw(auVar26,ZEXT416(5));
          auVar25._8_8_ = uStack_1c30;
          auVar25._0_8_ = local_1c38;
          auVar83 = psraw(auVar25,ZEXT416(5));
          auVar24._8_8_ = uStack_1c40;
          auVar24._0_8_ = local_1c48;
          auVar77 = psraw(auVar24,ZEXT416(5));
          local_1648 = auVar78._0_2_;
          sStack_1646 = auVar78._2_2_;
          sStack_1644 = auVar78._4_2_;
          sStack_1642 = auVar78._6_2_;
          sStack_1640 = auVar78._8_2_;
          sStack_163e = auVar78._10_2_;
          sStack_163c = auVar78._12_2_;
          sStack_163a = auVar78._14_2_;
          local_1c98._0_4_ = CONCAT22(sStack_1646 + 0x10,local_1648 + 0x10);
          local_1c98._0_6_ = CONCAT24(sStack_1644 + 0x10,(undefined4)local_1c98);
          local_1c98 = CONCAT26(sStack_1642 + 0x10,(undefined6)local_1c98);
          uStack_1c90._0_2_ = sStack_1640 + 0x10;
          uStack_1c90._2_2_ = sStack_163e + 0x10;
          uStack_1c90._4_2_ = sStack_163c + 0x10;
          uStack_1c90._6_2_ = sStack_163a + 0x10;
          local_1668 = auVar79._0_2_;
          sStack_1666 = auVar79._2_2_;
          sStack_1664 = auVar79._4_2_;
          sStack_1662 = auVar79._6_2_;
          sStack_1660 = auVar79._8_2_;
          sStack_165e = auVar79._10_2_;
          sStack_165c = auVar79._12_2_;
          sStack_165a = auVar79._14_2_;
          local_1ca8._0_4_ = CONCAT22(sStack_1666 + 0x10,local_1668 + 0x10);
          local_1ca8._0_6_ = CONCAT24(sStack_1664 + 0x10,(undefined4)local_1ca8);
          local_1ca8 = CONCAT26(sStack_1662 + 0x10,(undefined6)local_1ca8);
          uStack_1ca0._0_2_ = sStack_1660 + 0x10;
          uStack_1ca0._2_2_ = sStack_165e + 0x10;
          uStack_1ca0._4_2_ = sStack_165c + 0x10;
          uStack_1ca0._6_2_ = sStack_165a + 0x10;
          local_1688 = auVar80._0_2_;
          sStack_1686 = auVar80._2_2_;
          sStack_1684 = auVar80._4_2_;
          sStack_1682 = auVar80._6_2_;
          sStack_1680 = auVar80._8_2_;
          sStack_167e = auVar80._10_2_;
          sStack_167c = auVar80._12_2_;
          sStack_167a = auVar80._14_2_;
          local_1cb8._0_4_ = CONCAT22(sStack_1686 + 0x10,local_1688 + 0x10);
          local_1cb8._0_6_ = CONCAT24(sStack_1684 + 0x10,(undefined4)local_1cb8);
          local_1cb8 = CONCAT26(sStack_1682 + 0x10,(undefined6)local_1cb8);
          uStack_1cb0._0_2_ = sStack_1680 + 0x10;
          uStack_1cb0._2_2_ = sStack_167e + 0x10;
          uStack_1cb0._4_2_ = sStack_167c + 0x10;
          uStack_1cb0._6_2_ = sStack_167a + 0x10;
          local_16a8 = auVar81._0_2_;
          sStack_16a6 = auVar81._2_2_;
          sStack_16a4 = auVar81._4_2_;
          sStack_16a2 = auVar81._6_2_;
          sStack_16a0 = auVar81._8_2_;
          sStack_169e = auVar81._10_2_;
          sStack_169c = auVar81._12_2_;
          sStack_169a = auVar81._14_2_;
          local_1cc8._0_4_ = CONCAT22(sStack_16a6 + 0x10,local_16a8 + 0x10);
          local_1cc8._0_6_ = CONCAT24(sStack_16a4 + 0x10,(undefined4)local_1cc8);
          local_1cc8 = CONCAT26(sStack_16a2 + 0x10,(undefined6)local_1cc8);
          uStack_1cc0._0_2_ = sStack_16a0 + 0x10;
          uStack_1cc0._2_2_ = sStack_169e + 0x10;
          uStack_1cc0._4_2_ = sStack_169c + 0x10;
          uStack_1cc0._6_2_ = sStack_169a + 0x10;
          auVar81._8_8_ = uStack_1c90;
          auVar81._0_8_ = local_1c98;
          auVar81 = psraw(auVar81,ZEXT416(5));
          auVar80._8_8_ = uStack_1ca0;
          auVar80._0_8_ = local_1ca8;
          auVar80 = psraw(auVar80,ZEXT416(5));
          auVar79._8_8_ = uStack_1cb0;
          auVar79._0_8_ = local_1cb8;
          auVar79 = psraw(auVar79,ZEXT416(5));
          auVar78._8_8_ = uStack_1cc0;
          auVar78._0_8_ = local_1cc8;
          auVar78 = psraw(auVar78,ZEXT416(5));
          local_1168 = auVar75._0_2_;
          sStack_1166 = auVar75._2_2_;
          sStack_1164 = auVar75._4_2_;
          sStack_1162 = auVar75._6_2_;
          sStack_1160 = auVar75._8_2_;
          sStack_115e = auVar75._10_2_;
          sStack_115c = auVar75._12_2_;
          sStack_115a = auVar75._14_2_;
          local_1178 = auVar83._0_2_;
          sStack_1176 = auVar83._2_2_;
          sStack_1174 = auVar83._4_2_;
          sStack_1172 = auVar83._6_2_;
          sStack_1170 = auVar83._8_2_;
          sStack_116e = auVar83._10_2_;
          sStack_116c = auVar83._12_2_;
          sStack_116a = auVar83._14_2_;
          local_1188 = auVar76._0_2_;
          sStack_1186 = auVar76._2_2_;
          sStack_1184 = auVar76._4_2_;
          sStack_1182 = auVar76._6_2_;
          sStack_1180 = auVar76._8_2_;
          sStack_117e = auVar76._10_2_;
          sStack_117c = auVar76._12_2_;
          sStack_117a = auVar76._14_2_;
          local_1198 = auVar77._0_2_;
          sStack_1196 = auVar77._2_2_;
          sStack_1194 = auVar77._4_2_;
          sStack_1192 = auVar77._6_2_;
          sStack_1190 = auVar77._8_2_;
          sStack_118e = auVar77._10_2_;
          sStack_118c = auVar77._12_2_;
          sStack_118a = auVar77._14_2_;
          local_11a8 = auVar81._0_2_;
          sStack_11a6 = auVar81._2_2_;
          sStack_11a4 = auVar81._4_2_;
          sStack_11a2 = auVar81._6_2_;
          sStack_11a0 = auVar81._8_2_;
          sStack_119e = auVar81._10_2_;
          sStack_119c = auVar81._12_2_;
          sStack_119a = auVar81._14_2_;
          local_11b8 = auVar79._0_2_;
          sStack_11b6 = auVar79._2_2_;
          sStack_11b4 = auVar79._4_2_;
          sStack_11b2 = auVar79._6_2_;
          sStack_11b0 = auVar79._8_2_;
          sStack_11ae = auVar79._10_2_;
          sStack_11ac = auVar79._12_2_;
          sStack_11aa = auVar79._14_2_;
          local_11c8 = auVar80._0_2_;
          sStack_11c6 = auVar80._2_2_;
          sStack_11c4 = auVar80._4_2_;
          sStack_11c2 = auVar80._6_2_;
          sStack_11c0 = auVar80._8_2_;
          sStack_11be = auVar80._10_2_;
          sStack_11bc = auVar80._12_2_;
          sStack_11ba = auVar80._14_2_;
          local_11d8 = auVar78._0_2_;
          sStack_11d6 = auVar78._2_2_;
          sStack_11d4 = auVar78._4_2_;
          sStack_11d2 = auVar78._6_2_;
          sStack_11d0 = auVar78._8_2_;
          sStack_11ce = auVar78._10_2_;
          sStack_11cc = auVar78._12_2_;
          sStack_11ca = auVar78._14_2_;
          uVar3 = CONCAT11((0 < local_1188) * (local_1188 < 0x100) * auVar76[0] -
                           (0xff < local_1188),
                           (0 < local_1168) * (local_1168 < 0x100) * auVar75[0] -
                           (0xff < local_1168));
          uVar7 = CONCAT13((0 < sStack_1186) * (sStack_1186 < 0x100) * auVar76[2] -
                           (0xff < sStack_1186),
                           CONCAT12((0 < sStack_1166) * (sStack_1166 < 0x100) * auVar75[2] -
                                    (0xff < sStack_1166),uVar3));
          uVar4 = CONCAT15((0 < sStack_1184) * (sStack_1184 < 0x100) * auVar76[4] -
                           (0xff < sStack_1184),
                           CONCAT14((0 < sStack_1164) * (sStack_1164 < 0x100) * auVar75[4] -
                                    (0xff < sStack_1164),uVar7));
          uStack_1c50 = CONCAT11((0 < sStack_1180) * (sStack_1180 < 0x100) * auVar76[8] -
                                 (0xff < sStack_1180),
                                 (0 < sStack_1160) * (sStack_1160 < 0x100) * auVar75[8] -
                                 (0xff < sStack_1160));
          _uStack_1c50 = CONCAT13((0 < sStack_117e) * (sStack_117e < 0x100) * auVar76[10] -
                                  (0xff < sStack_117e),
                                  CONCAT12((0 < sStack_115e) * (sStack_115e < 0x100) * auVar75[10] -
                                           (0xff < sStack_115e),uStack_1c50));
          _uStack_1c50 = CONCAT15((0 < sStack_117c) * (sStack_117c < 0x100) * auVar76[0xc] -
                                  (0xff < sStack_117c),
                                  CONCAT14((0 < sStack_115c) * (sStack_115c < 0x100) * auVar75[0xc]
                                           - (0xff < sStack_115c),_uStack_1c50));
          _uStack_1c50 = CONCAT17((0 < sStack_117a) * (sStack_117a < 0x100) * auVar76[0xe] -
                                  (0xff < sStack_117a),
                                  CONCAT16((0 < sStack_115a) * (sStack_115a < 0x100) * auVar75[0xe]
                                           - (0xff < sStack_115a),_uStack_1c50));
          uVar5 = CONCAT11((0 < local_1198) * (local_1198 < 0x100) * auVar77[0] -
                           (0xff < local_1198),
                           (0 < local_1178) * (local_1178 < 0x100) * auVar83[0] -
                           (0xff < local_1178));
          uVar10 = CONCAT13((0 < sStack_1196) * (sStack_1196 < 0x100) * auVar77[2] -
                            (0xff < sStack_1196),
                            CONCAT12((0 < sStack_1176) * (sStack_1176 < 0x100) * auVar83[2] -
                                     (0xff < sStack_1176),uVar5));
          uVar8 = CONCAT15((0 < sStack_1194) * (sStack_1194 < 0x100) * auVar77[4] -
                           (0xff < sStack_1194),
                           CONCAT14((0 < sStack_1174) * (sStack_1174 < 0x100) * auVar83[4] -
                                    (0xff < sStack_1174),uVar10));
          uStack_1c60 = CONCAT11((0 < sStack_1190) * (sStack_1190 < 0x100) * auVar77[8] -
                                 (0xff < sStack_1190),
                                 (0 < sStack_1170) * (sStack_1170 < 0x100) * auVar83[8] -
                                 (0xff < sStack_1170));
          _uStack_1c60 = CONCAT13((0 < sStack_118e) * (sStack_118e < 0x100) * auVar77[10] -
                                  (0xff < sStack_118e),
                                  CONCAT12((0 < sStack_116e) * (sStack_116e < 0x100) * auVar83[10] -
                                           (0xff < sStack_116e),uStack_1c60));
          _uStack_1c60 = CONCAT15((0 < sStack_118c) * (sStack_118c < 0x100) * auVar77[0xc] -
                                  (0xff < sStack_118c),
                                  CONCAT14((0 < sStack_116c) * (sStack_116c < 0x100) * auVar83[0xc]
                                           - (0xff < sStack_116c),_uStack_1c60));
          _uStack_1c60 = CONCAT17((0 < sStack_118a) * (sStack_118a < 0x100) * auVar77[0xe] -
                                  (0xff < sStack_118a),
                                  CONCAT16((0 < sStack_116a) * (sStack_116a < 0x100) * auVar83[0xe]
                                           - (0xff < sStack_116a),_uStack_1c60));
          uStack_396 = (undefined2)((uint)uVar7 >> 0x10);
          uStack_394 = (undefined2)((uint6)uVar4 >> 0x20);
          uStack_392 = (undefined2)
                       (CONCAT17((0 < sStack_1182) * (sStack_1182 < 0x100) * auVar76[6] -
                                 (0xff < sStack_1182),
                                 CONCAT16((0 < sStack_1162) * (sStack_1162 < 0x100) * auVar75[6] -
                                          (0xff < sStack_1162),uVar4)) >> 0x30);
          uStack_3a6 = (undefined2)((uint)uVar10 >> 0x10);
          uStack_3a4 = (undefined2)((uint6)uVar8 >> 0x20);
          uStack_3a2 = (undefined2)
                       (CONCAT17((0 < sStack_1192) * (sStack_1192 < 0x100) * auVar77[6] -
                                 (0xff < sStack_1192),
                                 CONCAT16((0 < sStack_1172) * (sStack_1172 < 0x100) * auVar83[6] -
                                          (0xff < sStack_1172),uVar8)) >> 0x30);
          local_1c78 = CONCAT22(uVar5,uVar3);
          _local_1c78 = CONCAT26(uStack_3a6,CONCAT24(uStack_396,local_1c78));
          uStack_1c70 = CONCAT22(uStack_3a4,uStack_394);
          _uStack_1c70 = CONCAT26(uStack_3a2,CONCAT24(uStack_392,uStack_1c70));
          uStack_10e = (undefined2)((uint)_uStack_1c50 >> 0x10);
          uStack_10c = (undefined2)((uint6)_uStack_1c50 >> 0x20);
          uStack_10a = (undefined2)((ulong)_uStack_1c50 >> 0x30);
          uStack_11e = (undefined2)((uint)_uStack_1c60 >> 0x10);
          uStack_11c = (undefined2)((uint6)_uStack_1c60 >> 0x20);
          uStack_11a = (undefined2)((ulong)_uStack_1c60 >> 0x30);
          local_1c88 = CONCAT22(uStack_1c60,uStack_1c50);
          _local_1c88 = CONCAT26(uStack_11e,CONCAT24(uStack_10e,local_1c88));
          uStack_1c80 = CONCAT22(uStack_11c,uStack_10c);
          _uStack_1c80 = CONCAT26(uStack_11a,CONCAT24(uStack_10a,uStack_1c80));
          uVar6 = CONCAT11((0 < local_11c8) * (local_11c8 < 0x100) * auVar80[0] -
                           (0xff < local_11c8),
                           (0 < local_11a8) * (local_11a8 < 0x100) * auVar81[0] -
                           (0xff < local_11a8));
          uVar10 = CONCAT13((0 < sStack_11c6) * (sStack_11c6 < 0x100) * auVar80[2] -
                            (0xff < sStack_11c6),
                            CONCAT12((0 < sStack_11a6) * (sStack_11a6 < 0x100) * auVar81[2] -
                                     (0xff < sStack_11a6),uVar6));
          uVar8 = CONCAT15((0 < sStack_11c4) * (sStack_11c4 < 0x100) * auVar80[4] -
                           (0xff < sStack_11c4),
                           CONCAT14((0 < sStack_11a4) * (sStack_11a4 < 0x100) * auVar81[4] -
                                    (0xff < sStack_11a4),uVar10));
          uVar3 = CONCAT11((0 < local_11d8) * (local_11d8 < 0x100) * auVar78[0] -
                           (0xff < local_11d8),
                           (0 < local_11b8) * (local_11b8 < 0x100) * auVar79[0] -
                           (0xff < local_11b8));
          uVar7 = CONCAT13((0 < sStack_11d6) * (sStack_11d6 < 0x100) * auVar78[2] -
                           (0xff < sStack_11d6),
                           CONCAT12((0 < sStack_11b6) * (sStack_11b6 < 0x100) * auVar79[2] -
                                    (0xff < sStack_11b6),uVar3));
          uVar4 = CONCAT15((0 < sStack_11d4) * (sStack_11d4 < 0x100) * auVar78[4] -
                           (0xff < sStack_11d4),
                           CONCAT14((0 < sStack_11b4) * (sStack_11b4 < 0x100) * auVar79[4] -
                                    (0xff < sStack_11b4),uVar7));
          uStack_3b6 = (undefined2)((uint)uVar10 >> 0x10);
          uStack_3b4 = (undefined2)((uint6)uVar8 >> 0x20);
          uStack_3b2 = (undefined2)
                       (CONCAT17((0 < sStack_11c2) * (sStack_11c2 < 0x100) * auVar80[6] -
                                 (0xff < sStack_11c2),
                                 CONCAT16((0 < sStack_11a2) * (sStack_11a2 < 0x100) * auVar81[6] -
                                          (0xff < sStack_11a2),uVar8)) >> 0x30);
          uStack_3c6 = (undefined2)((uint)uVar7 >> 0x10);
          uStack_3c4 = (undefined2)((uint6)uVar4 >> 0x20);
          uStack_3c2 = (undefined2)
                       (CONCAT17((0 < sStack_11d2) * (sStack_11d2 < 0x100) * auVar78[6] -
                                 (0xff < sStack_11d2),
                                 CONCAT16((0 < sStack_11b2) * (sStack_11b2 < 0x100) * auVar79[6] -
                                          (0xff < sStack_11b2),uVar4)) >> 0x30);
          uVar9 = CONCAT11((0 < sStack_11c0) * (sStack_11c0 < 0x100) * auVar80[8] -
                           (0xff < sStack_11c0),
                           (0 < sStack_11a0) * (sStack_11a0 < 0x100) * auVar81[8] -
                           (0xff < sStack_11a0));
          uVar10 = CONCAT13((0 < sStack_11be) * (sStack_11be < 0x100) * auVar80[10] -
                            (0xff < sStack_11be),
                            CONCAT12((0 < sStack_119e) * (sStack_119e < 0x100) * auVar81[10] -
                                     (0xff < sStack_119e),uVar9));
          uVar8 = CONCAT15((0 < sStack_11bc) * (sStack_11bc < 0x100) * auVar80[0xc] -
                           (0xff < sStack_11bc),
                           CONCAT14((0 < sStack_119c) * (sStack_119c < 0x100) * auVar81[0xc] -
                                    (0xff < sStack_119c),uVar10));
          uVar5 = CONCAT11((0 < sStack_11d0) * (sStack_11d0 < 0x100) * auVar78[8] -
                           (0xff < sStack_11d0),
                           (0 < sStack_11b0) * (sStack_11b0 < 0x100) * auVar79[8] -
                           (0xff < sStack_11b0));
          uVar7 = CONCAT13((0 < sStack_11ce) * (sStack_11ce < 0x100) * auVar78[10] -
                           (0xff < sStack_11ce),
                           CONCAT12((0 < sStack_11ae) * (sStack_11ae < 0x100) * auVar79[10] -
                                    (0xff < sStack_11ae),uVar5));
          uVar4 = CONCAT15((0 < sStack_11cc) * (sStack_11cc < 0x100) * auVar78[0xc] -
                           (0xff < sStack_11cc),
                           CONCAT14((0 < sStack_11ac) * (sStack_11ac < 0x100) * auVar79[0xc] -
                                    (0xff < sStack_11ac),uVar7));
          uStack_12e = (undefined2)((uint)uVar10 >> 0x10);
          uStack_12c = (undefined2)((uint6)uVar8 >> 0x20);
          uStack_12a = (undefined2)
                       (CONCAT17((0 < sStack_11ba) * (sStack_11ba < 0x100) * auVar80[0xe] -
                                 (0xff < sStack_11ba),
                                 CONCAT16((0 < sStack_119a) * (sStack_119a < 0x100) * auVar81[0xe] -
                                          (0xff < sStack_119a),uVar8)) >> 0x30);
          uStack_13e = (undefined2)((uint)uVar7 >> 0x10);
          uStack_13c = (undefined2)((uint6)uVar4 >> 0x20);
          uStack_13a = (undefined2)
                       (CONCAT17((0 < sStack_11ca) * (sStack_11ca < 0x100) * auVar78[0xe] -
                                 (0xff < sStack_11ca),
                                 CONCAT16((0 < sStack_11aa) * (sStack_11aa < 0x100) * auVar79[0xe] -
                                          (0xff < sStack_11aa),uVar4)) >> 0x30);
          uVar7 = CONCAT22(uVar3,uVar6);
          uStack_94 = (undefined4)((ulong)_local_1c78 >> 0x20);
          uStack_a4 = (undefined4)(CONCAT26(uStack_3c6,CONCAT24(uStack_3b6,uVar7)) >> 0x20);
          local_1c18 = CONCAT44(uVar7,local_1c78);
          uStack_1c10._0_4_ = uStack_94;
          uStack_1c10._4_4_ = uStack_a4;
          src_temp13_8x16b_1[0]._4_4_ = (undefined4)((ulong)_uStack_1c70 >> 0x20);
          src_temp14_8x16b_1[0]._4_4_ =
               (undefined4)
               (CONCAT26(uStack_3c2,CONCAT24(uStack_3b2,CONCAT22(uStack_3c4,uStack_3b4))) >> 0x20);
          local_1c28 = CONCAT44(CONCAT22(uStack_3c4,uStack_3b4),uStack_1c70);
          uStack_1c20._0_4_ = src_temp13_8x16b_1[0]._4_4_;
          uStack_1c20._4_4_ = src_temp14_8x16b_1[0]._4_4_;
          uVar7 = CONCAT22(uVar5,uVar9);
          uStack_b4 = (undefined4)((ulong)_local_1c88 >> 0x20);
          uStack_c4 = (undefined4)(CONCAT26(uStack_13e,CONCAT24(uStack_12e,uVar7)) >> 0x20);
          local_1c38 = CONCAT44(uVar7,local_1c88);
          uStack_1c30._0_4_ = uStack_b4;
          uStack_1c30._4_4_ = uStack_c4;
          src_temp15_8x16b_1[0]._4_4_ = (undefined4)((ulong)_uStack_1c80 >> 0x20);
          src_temp16_8x16b_1[0]._4_4_ =
               (undefined4)
               (CONCAT26(uStack_13a,CONCAT24(uStack_12a,CONCAT22(uStack_13c,uStack_12c))) >> 0x20);
          local_1c48 = CONCAT44(CONCAT22(uStack_13c,uStack_12c),uStack_1c80);
          uStack_1c40._0_4_ = src_temp15_8x16b_1[0]._4_4_;
          uStack_1c40._4_4_ = src_temp16_8x16b_1[0]._4_4_;
          *(undefined8 *)((long)in_RDX + (long)(in_ECX * (local_1950 + 7)) + (long)local_1954) =
               local_1c18;
          *(undefined8 *)((long)in_RDX + (long)(in_ECX * (local_1950 + 6)) + (long)local_1954) =
               uStack_1c10;
          *(undefined8 *)((long)in_RDX + (long)(in_ECX * (local_1950 + 5)) + (long)local_1954) =
               local_1c28;
          *(undefined8 *)((long)in_RDX + (long)(in_ECX * (local_1950 + 4)) + (long)local_1954) =
               uStack_1c20;
          *(undefined8 *)((long)in_RDX + (long)(in_ECX * (local_1950 + 3)) + (long)local_1954) =
               local_1c38;
          *(undefined8 *)((long)in_RDX + (long)(in_ECX * (local_1950 + 2)) + (long)local_1954) =
               uStack_1c30;
          *(undefined8 *)((long)in_RDX + (long)(in_ECX * (local_1950 + 1)) + (long)local_1954) =
               local_1c48;
          *(undefined8 *)((long)in_RDX + (long)(in_ECX * local_1950) + (long)local_1954) =
               uStack_1c40;
        }
      }
    }
    else {
      local_1a08._0_4_ = CONCAT22(local_195c * 2,local_195c);
      local_1a08._0_6_ = CONCAT24(local_195c * 3,(undefined4)local_1a08);
      local_1a08 = CONCAT26(local_195c * 4,(undefined6)local_1a08);
      uStack_1a00._0_2_ = local_195c * 5;
      uStack_1a00._2_2_ = local_195c * 6;
      uStack_1a00._4_2_ = local_195c * 7;
      uStack_1a00._6_2_ = local_195c * 8;
      uVar74 = local_1a08 & 0x1f001f001f001f;
      uVar82 = uStack_1a00 & 0x1f001f001f001f;
      auVar23._8_8_ = uStack_1a00;
      auVar23._0_8_ = local_1a08;
      auVar75 = psraw(auVar23,ZEXT416(5));
      local_b58 = auVar75._0_2_;
      sStack_b56 = auVar75._2_2_;
      sStack_b54 = auVar75._4_2_;
      sStack_b52 = auVar75._6_2_;
      sStack_b50 = auVar75._8_2_;
      sStack_b4e = auVar75._10_2_;
      sStack_b4c = auVar75._12_2_;
      sStack_b4a = auVar75._14_2_;
      local_b78 = (short)uVar74;
      sStack_b76 = (short)(uVar74 >> 0x10);
      sStack_b74 = (short)(uVar74 >> 0x20);
      sStack_b72 = (short)(uVar74 >> 0x30);
      sStack_b70 = (short)uVar82;
      sStack_b6e = (short)(uVar82 >> 0x10);
      sStack_b6c = (short)(uVar82 >> 0x20);
      sStack_b6a = (short)(uVar82 >> 0x30);
      local_1d38 = CONCAT26(0x20 - sStack_b72,
                            CONCAT24(0x20 - sStack_b74,CONCAT22(0x20 - sStack_b76,0x20 - local_b78))
                           );
      uStack_1d30 = CONCAT26(0x20 - sStack_b6a,
                             CONCAT24(0x20 - sStack_b6c,
                                      CONCAT22(0x20 - sStack_b6e,0x20 - sStack_b70)));
      auVar12._8_8_ = uVar82;
      auVar12._0_8_ = uVar74;
      auVar75 = psllw(auVar12,ZEXT416(8));
      auVar11._8_8_ = uStack_1d30;
      auVar11._0_8_ = local_1d38;
      auVar76 = psllw(auVar11,ZEXT416(8));
      local_1d28 = auVar75._0_8_;
      uStack_1d20 = auVar75._8_8_;
      uVar74 = uVar74 | local_1d28;
      uVar82 = uVar82 | uStack_1d20;
      local_1d48 = auVar76._0_8_;
      uStack_1d40 = auVar76._8_8_;
      local_1d38 = local_1d38 | local_1d48;
      uStack_1d30 = uStack_1d30 | uStack_1d40;
      uStack_830 = (undefined1)uStack_1d30;
      uStack_82f = (undefined1)(uStack_1d30 >> 8);
      uStack_82e = (undefined1)(uStack_1d30 >> 0x10);
      uStack_82d = (undefined1)(uStack_1d30 >> 0x18);
      uStack_82c = (undefined1)(uStack_1d30 >> 0x20);
      uStack_82b = (undefined1)(uStack_1d30 >> 0x28);
      uStack_82a = (undefined1)(uStack_1d30 >> 0x30);
      uStack_829 = (undefined1)(uStack_1d30 >> 0x38);
      uStack_840 = (undefined1)uVar82;
      uStack_83f = auVar75[9];
      uStack_83e = (undefined1)(uVar82 >> 0x10);
      uStack_83d = auVar75[0xb];
      uStack_83c = (undefined1)(uVar82 >> 0x20);
      uStack_83b = auVar75[0xd];
      uStack_83a = (undefined1)(uVar82 >> 0x30);
      uStack_839 = auVar75[0xf];
      local_1d58 = CONCAT13(uStack_83f,CONCAT12(uStack_82f,CONCAT11(uStack_840,uStack_830)));
      uStack_1d54 = CONCAT13(uStack_83d,CONCAT12(uStack_82d,CONCAT11(uStack_83e,uStack_82e)));
      uStack_1d50 = CONCAT13(uStack_83b,CONCAT12(uStack_82b,CONCAT11(uStack_83c,uStack_82c)));
      uStack_1d4c = CONCAT13(uStack_839,CONCAT12(uStack_829,CONCAT11(uStack_83a,uStack_82a)));
      uStack_737 = (undefined1)(local_1d38 >> 8);
      uStack_736 = (undefined1)(local_1d38 >> 0x10);
      uStack_735 = (undefined1)(local_1d38 >> 0x18);
      uStack_734 = (undefined1)(local_1d38 >> 0x20);
      uStack_733 = (undefined1)(local_1d38 >> 0x28);
      uStack_732 = (undefined1)(local_1d38 >> 0x30);
      uStack_731 = (undefined1)(local_1d38 >> 0x38);
      local_748 = (undefined1)uVar74;
      uStack_747 = auVar75[1];
      uStack_746 = (undefined1)(uVar74 >> 0x10);
      uStack_745 = auVar75[3];
      uStack_744 = (undefined1)(uVar74 >> 0x20);
      uStack_743 = auVar75[5];
      uStack_742 = (undefined1)(uVar74 >> 0x30);
      uStack_741 = auVar75[7];
      uVar2 = CONCAT13(uStack_747,CONCAT12(uStack_737,CONCAT11(local_748,(char)local_1d38)));
      uStack_19b0._0_2_ = CONCAT11(uStack_744,uStack_734);
      uStack_19b0._0_3_ = CONCAT12(uStack_733,(undefined2)uStack_19b0);
      uStack_19b0 = CONCAT13(uStack_743,(undefined3)uStack_19b0);
      _uStack_19b0 = CONCAT14(uStack_732,uStack_19b0);
      _uStack_19b0 = CONCAT15(uStack_742,_uStack_19b0);
      _uStack_19b0 = CONCAT16(uStack_731,_uStack_19b0);
      _uStack_19b0 = CONCAT17(uStack_741,_uStack_19b0);
      uStack_19b4 = (undefined4)
                    (CONCAT17(uStack_745,
                              CONCAT16(uStack_735,CONCAT15(uStack_746,CONCAT14(uStack_736,uVar2))))
                    >> 0x20);
      auVar39[8] = '\x05';
      auVar39[9] = '\x04';
      auVar39[10] = '\x06';
      auVar39[0xb] = '\x05';
      auVar39[0xc] = '\a';
      auVar39[0xd] = '\x06';
      auVar39[0xe] = '\b';
      auVar39[0xf] = '\a';
      auVar39[0] = '\x01';
      auVar39[1] = '\0';
      auVar39[2] = '\x02';
      auVar39[3] = '\x01';
      auVar39[4] = '\x03';
      auVar39[5] = '\x02';
      auVar39[6] = '\x04';
      auVar39[7] = '\x03';
      auVar75 = pshufb(*(undefined1 (*) [16])(in_RDI + -1 + (long)(short)(sVar73 - local_b58)),
                       auVar39);
      auVar38[8] = '\x05';
      auVar38[9] = '\x04';
      auVar38[10] = '\x06';
      auVar38[0xb] = '\x05';
      auVar38[0xc] = '\a';
      auVar38[0xd] = '\x06';
      auVar38[0xe] = '\b';
      auVar38[0xf] = '\a';
      auVar38[0] = '\x01';
      auVar38[1] = '\0';
      auVar38[2] = '\x02';
      auVar38[3] = '\x01';
      auVar38[4] = '\x03';
      auVar38[5] = '\x02';
      auVar38[6] = '\x04';
      auVar38[7] = '\x03';
      auVar76 = pshufb(*(undefined1 (*) [16])(in_RDI + -1 + (long)(short)(sVar73 - sStack_b56)),
                       auVar38);
      auVar37[8] = '\x05';
      auVar37[9] = '\x04';
      auVar37[10] = '\x06';
      auVar37[0xb] = '\x05';
      auVar37[0xc] = '\a';
      auVar37[0xd] = '\x06';
      auVar37[0xe] = '\b';
      auVar37[0xf] = '\a';
      auVar37[0] = '\x01';
      auVar37[1] = '\0';
      auVar37[2] = '\x02';
      auVar37[3] = '\x01';
      auVar37[4] = '\x03';
      auVar37[5] = '\x02';
      auVar37[6] = '\x04';
      auVar37[7] = '\x03';
      auVar83 = pshufb(*(undefined1 (*) [16])(in_RDI + -1 + (long)(short)(sVar73 - sStack_b54)),
                       auVar37);
      auVar36[8] = '\x05';
      auVar36[9] = '\x04';
      auVar36[10] = '\x06';
      auVar36[0xb] = '\x05';
      auVar36[0xc] = '\a';
      auVar36[0xd] = '\x06';
      auVar36[0xe] = '\b';
      auVar36[0xf] = '\a';
      auVar36[0] = '\x01';
      auVar36[1] = '\0';
      auVar36[2] = '\x02';
      auVar36[3] = '\x01';
      auVar36[4] = '\x03';
      auVar36[5] = '\x02';
      auVar36[6] = '\x04';
      auVar36[7] = '\x03';
      auVar77 = pshufb(*(undefined1 (*) [16])(in_RDI + -1 + (long)(short)(sVar73 - sStack_b52)),
                       auVar36);
      auVar35[8] = '\x05';
      auVar35[9] = '\x04';
      auVar35[10] = '\x06';
      auVar35[0xb] = '\x05';
      auVar35[0xc] = '\a';
      auVar35[0xd] = '\x06';
      auVar35[0xe] = '\b';
      auVar35[0xf] = '\a';
      auVar35[0] = '\x01';
      auVar35[1] = '\0';
      auVar35[2] = '\x02';
      auVar35[3] = '\x01';
      auVar35[4] = '\x03';
      auVar35[5] = '\x02';
      auVar35[6] = '\x04';
      auVar35[7] = '\x03';
      auVar78 = pshufb(*(undefined1 (*) [16])(in_RDI + -1 + (long)(short)(sVar73 - sStack_b50)),
                       auVar35);
      auVar34[8] = '\x05';
      auVar34[9] = '\x04';
      auVar34[10] = '\x06';
      auVar34[0xb] = '\x05';
      auVar34[0xc] = '\a';
      auVar34[0xd] = '\x06';
      auVar34[0xe] = '\b';
      auVar34[0xf] = '\a';
      auVar34[0] = '\x01';
      auVar34[1] = '\0';
      auVar34[2] = '\x02';
      auVar34[3] = '\x01';
      auVar34[4] = '\x03';
      auVar34[5] = '\x02';
      auVar34[6] = '\x04';
      auVar34[7] = '\x03';
      auVar79 = pshufb(*(undefined1 (*) [16])(in_RDI + -1 + (long)(short)(sVar73 - sStack_b4e)),
                       auVar34);
      auVar33[8] = '\x05';
      auVar33[9] = '\x04';
      auVar33[10] = '\x06';
      auVar33[0xb] = '\x05';
      auVar33[0xc] = '\a';
      auVar33[0xd] = '\x06';
      auVar33[0xe] = '\b';
      auVar33[0xf] = '\a';
      auVar33[0] = '\x01';
      auVar33[1] = '\0';
      auVar33[2] = '\x02';
      auVar33[3] = '\x01';
      auVar33[4] = '\x03';
      auVar33[5] = '\x02';
      auVar33[6] = '\x04';
      auVar33[7] = '\x03';
      auVar80 = pshufb(*(undefined1 (*) [16])(in_RDI + -1 + (long)(short)(sVar73 - sStack_b4c)),
                       auVar33);
      auVar32[8] = '\x05';
      auVar32[9] = '\x04';
      auVar32[10] = '\x06';
      auVar32[0xb] = '\x05';
      auVar32[0xc] = '\a';
      auVar32[0xd] = '\x06';
      auVar32[0xe] = '\b';
      auVar32[0xf] = '\a';
      auVar32[0] = '\x01';
      auVar32[1] = '\0';
      auVar32[2] = '\x02';
      auVar32[3] = '\x01';
      auVar32[4] = '\x03';
      auVar32[5] = '\x02';
      auVar32[6] = '\x04';
      auVar32[7] = '\x03';
      auVar81 = pshufb(*(undefined1 (*) [16])(in_RDI + -1 + (long)(short)(sVar73 - sStack_b4a)),
                       auVar32);
      auVar60._4_4_ = uVar2;
      auVar60._0_4_ = uVar2;
      auVar60._12_4_ = uVar2;
      auVar60._8_4_ = uVar2;
      auVar75 = pmaddubsw(auVar75,auVar60);
      auVar59._4_4_ = uStack_19b4;
      auVar59._0_4_ = uStack_19b4;
      auVar59._12_4_ = uStack_19b4;
      auVar59._8_4_ = uStack_19b4;
      auVar76 = pmaddubsw(auVar76,auVar59);
      auVar58._4_4_ = uStack_19b0;
      auVar58._0_4_ = uStack_19b0;
      auVar58._12_4_ = uStack_19b0;
      auVar58._8_4_ = uStack_19b0;
      auVar83 = pmaddubsw(auVar83,auVar58);
      auVar57._4_4_ = uStack_19ac;
      auVar57._0_4_ = uStack_19ac;
      auVar57._12_4_ = uStack_19ac;
      auVar57._8_4_ = uStack_19ac;
      auVar77 = pmaddubsw(auVar77,auVar57);
      auVar56._4_4_ = local_1d58;
      auVar56._0_4_ = local_1d58;
      auVar56._12_4_ = local_1d58;
      auVar56._8_4_ = local_1d58;
      auVar78 = pmaddubsw(auVar78,auVar56);
      auVar55._4_4_ = uStack_1d54;
      auVar55._0_4_ = uStack_1d54;
      auVar55._12_4_ = uStack_1d54;
      auVar55._8_4_ = uStack_1d54;
      auVar79 = pmaddubsw(auVar79,auVar55);
      auVar54._4_4_ = uStack_1d50;
      auVar54._0_4_ = uStack_1d50;
      auVar54._12_4_ = uStack_1d50;
      auVar54._8_4_ = uStack_1d50;
      auVar80 = pmaddubsw(auVar80,auVar54);
      auVar53._4_4_ = uStack_1d4c;
      auVar53._0_4_ = uStack_1d4c;
      auVar53._12_4_ = uStack_1d4c;
      auVar53._8_4_ = uStack_1d4c;
      auVar81 = pmaddubsw(auVar81,auVar53);
      local_16c8 = auVar75._0_2_;
      sStack_16c6 = auVar75._2_2_;
      sStack_16c4 = auVar75._4_2_;
      sStack_16c2 = auVar75._6_2_;
      sStack_16c0 = auVar75._8_2_;
      sStack_16be = auVar75._10_2_;
      sStack_16bc = auVar75._12_2_;
      sStack_16ba = auVar75._14_2_;
      local_1de8._0_4_ = CONCAT22(sStack_16c6 + 0x10,local_16c8 + 0x10);
      local_1de8._0_6_ = CONCAT24(sStack_16c4 + 0x10,(undefined4)local_1de8);
      local_1de8 = CONCAT26(sStack_16c2 + 0x10,(undefined6)local_1de8);
      uStack_1de0._0_2_ = sStack_16c0 + 0x10;
      uStack_1de0._2_2_ = sStack_16be + 0x10;
      uStack_1de0._4_2_ = sStack_16bc + 0x10;
      uStack_1de0._6_2_ = sStack_16ba + 0x10;
      local_16e8 = auVar76._0_2_;
      sStack_16e6 = auVar76._2_2_;
      sStack_16e4 = auVar76._4_2_;
      sStack_16e2 = auVar76._6_2_;
      sStack_16e0 = auVar76._8_2_;
      sStack_16de = auVar76._10_2_;
      sStack_16dc = auVar76._12_2_;
      sStack_16da = auVar76._14_2_;
      local_1df8._0_4_ = CONCAT22(sStack_16e6 + 0x10,local_16e8 + 0x10);
      local_1df8._0_6_ = CONCAT24(sStack_16e4 + 0x10,(undefined4)local_1df8);
      local_1df8 = CONCAT26(sStack_16e2 + 0x10,(undefined6)local_1df8);
      uStack_1df0._0_2_ = sStack_16e0 + 0x10;
      uStack_1df0._2_2_ = sStack_16de + 0x10;
      uStack_1df0._4_2_ = sStack_16dc + 0x10;
      uStack_1df0._6_2_ = sStack_16da + 0x10;
      local_1708 = auVar83._0_2_;
      sStack_1706 = auVar83._2_2_;
      sStack_1704 = auVar83._4_2_;
      sStack_1702 = auVar83._6_2_;
      sStack_1700 = auVar83._8_2_;
      sStack_16fe = auVar83._10_2_;
      sStack_16fc = auVar83._12_2_;
      sStack_16fa = auVar83._14_2_;
      local_1e08._0_4_ = CONCAT22(sStack_1706 + 0x10,local_1708 + 0x10);
      local_1e08._0_6_ = CONCAT24(sStack_1704 + 0x10,(undefined4)local_1e08);
      local_1e08 = CONCAT26(sStack_1702 + 0x10,(undefined6)local_1e08);
      uStack_1e00._0_2_ = sStack_1700 + 0x10;
      uStack_1e00._2_2_ = sStack_16fe + 0x10;
      uStack_1e00._4_2_ = sStack_16fc + 0x10;
      uStack_1e00._6_2_ = sStack_16fa + 0x10;
      local_1728 = auVar77._0_2_;
      sStack_1726 = auVar77._2_2_;
      sStack_1724 = auVar77._4_2_;
      sStack_1722 = auVar77._6_2_;
      sStack_1720 = auVar77._8_2_;
      sStack_171e = auVar77._10_2_;
      sStack_171c = auVar77._12_2_;
      sStack_171a = auVar77._14_2_;
      local_1e18._0_4_ = CONCAT22(sStack_1726 + 0x10,local_1728 + 0x10);
      local_1e18._0_6_ = CONCAT24(sStack_1724 + 0x10,(undefined4)local_1e18);
      local_1e18 = CONCAT26(sStack_1722 + 0x10,(undefined6)local_1e18);
      uStack_1e10._0_2_ = sStack_1720 + 0x10;
      uStack_1e10._2_2_ = sStack_171e + 0x10;
      uStack_1e10._4_2_ = sStack_171c + 0x10;
      uStack_1e10._6_2_ = sStack_171a + 0x10;
      auVar22._8_8_ = uStack_1de0;
      auVar22._0_8_ = local_1de8;
      auVar75 = psraw(auVar22,ZEXT416(5));
      auVar21._8_8_ = uStack_1df0;
      auVar21._0_8_ = local_1df8;
      auVar76 = psraw(auVar21,ZEXT416(5));
      auVar20._8_8_ = uStack_1e00;
      auVar20._0_8_ = local_1e08;
      auVar83 = psraw(auVar20,ZEXT416(5));
      auVar19._8_8_ = uStack_1e10;
      auVar19._0_8_ = local_1e18;
      auVar77 = psraw(auVar19,ZEXT416(5));
      local_1748 = auVar78._0_2_;
      sStack_1746 = auVar78._2_2_;
      sStack_1744 = auVar78._4_2_;
      sStack_1742 = auVar78._6_2_;
      sStack_1740 = auVar78._8_2_;
      sStack_173e = auVar78._10_2_;
      sStack_173c = auVar78._12_2_;
      sStack_173a = auVar78._14_2_;
      local_1e68._0_4_ = CONCAT22(sStack_1746 + 0x10,local_1748 + 0x10);
      local_1e68._0_6_ = CONCAT24(sStack_1744 + 0x10,(undefined4)local_1e68);
      local_1e68 = CONCAT26(sStack_1742 + 0x10,(undefined6)local_1e68);
      uStack_1e60._0_2_ = sStack_1740 + 0x10;
      uStack_1e60._2_2_ = sStack_173e + 0x10;
      uStack_1e60._4_2_ = sStack_173c + 0x10;
      uStack_1e60._6_2_ = sStack_173a + 0x10;
      local_1768 = auVar79._0_2_;
      sStack_1766 = auVar79._2_2_;
      sStack_1764 = auVar79._4_2_;
      sStack_1762 = auVar79._6_2_;
      sStack_1760 = auVar79._8_2_;
      sStack_175e = auVar79._10_2_;
      sStack_175c = auVar79._12_2_;
      sStack_175a = auVar79._14_2_;
      local_1e78._0_4_ = CONCAT22(sStack_1766 + 0x10,local_1768 + 0x10);
      local_1e78._0_6_ = CONCAT24(sStack_1764 + 0x10,(undefined4)local_1e78);
      local_1e78 = CONCAT26(sStack_1762 + 0x10,(undefined6)local_1e78);
      uStack_1e70._0_2_ = sStack_1760 + 0x10;
      uStack_1e70._2_2_ = sStack_175e + 0x10;
      uStack_1e70._4_2_ = sStack_175c + 0x10;
      uStack_1e70._6_2_ = sStack_175a + 0x10;
      local_1788 = auVar80._0_2_;
      sStack_1786 = auVar80._2_2_;
      sStack_1784 = auVar80._4_2_;
      sStack_1782 = auVar80._6_2_;
      sStack_1780 = auVar80._8_2_;
      sStack_177e = auVar80._10_2_;
      sStack_177c = auVar80._12_2_;
      sStack_177a = auVar80._14_2_;
      local_1e88._0_4_ = CONCAT22(sStack_1786 + 0x10,local_1788 + 0x10);
      local_1e88._0_6_ = CONCAT24(sStack_1784 + 0x10,(undefined4)local_1e88);
      local_1e88 = CONCAT26(sStack_1782 + 0x10,(undefined6)local_1e88);
      uStack_1e80._0_2_ = sStack_1780 + 0x10;
      uStack_1e80._2_2_ = sStack_177e + 0x10;
      uStack_1e80._4_2_ = sStack_177c + 0x10;
      uStack_1e80._6_2_ = sStack_177a + 0x10;
      local_17a8 = auVar81._0_2_;
      sStack_17a6 = auVar81._2_2_;
      sStack_17a4 = auVar81._4_2_;
      sStack_17a2 = auVar81._6_2_;
      sStack_17a0 = auVar81._8_2_;
      sStack_179e = auVar81._10_2_;
      sStack_179c = auVar81._12_2_;
      sStack_179a = auVar81._14_2_;
      local_1e98._0_4_ = CONCAT22(sStack_17a6 + 0x10,local_17a8 + 0x10);
      local_1e98._0_6_ = CONCAT24(sStack_17a4 + 0x10,(undefined4)local_1e98);
      local_1e98 = CONCAT26(sStack_17a2 + 0x10,(undefined6)local_1e98);
      uStack_1e90._0_2_ = sStack_17a0 + 0x10;
      uStack_1e90._2_2_ = sStack_179e + 0x10;
      uStack_1e90._4_2_ = sStack_179c + 0x10;
      uStack_1e90._6_2_ = sStack_179a + 0x10;
      auVar18._8_8_ = uStack_1e60;
      auVar18._0_8_ = local_1e68;
      auVar78 = psraw(auVar18,ZEXT416(5));
      auVar17._8_8_ = uStack_1e70;
      auVar17._0_8_ = local_1e78;
      auVar79 = psraw(auVar17,ZEXT416(5));
      auVar16._8_8_ = uStack_1e80;
      auVar16._0_8_ = local_1e88;
      auVar80 = psraw(auVar16,ZEXT416(5));
      auVar15._8_8_ = uStack_1e90;
      auVar15._0_8_ = local_1e98;
      auVar81 = psraw(auVar15,ZEXT416(5));
      local_11e8 = auVar75._0_2_;
      sStack_11e6 = auVar75._2_2_;
      sStack_11e4 = auVar75._4_2_;
      sStack_11e2 = auVar75._6_2_;
      sStack_11e0 = auVar75._8_2_;
      sStack_11de = auVar75._10_2_;
      sStack_11dc = auVar75._12_2_;
      sStack_11da = auVar75._14_2_;
      local_11f8 = auVar83._0_2_;
      sStack_11f6 = auVar83._2_2_;
      sStack_11f4 = auVar83._4_2_;
      sStack_11f2 = auVar83._6_2_;
      sStack_11f0 = auVar83._8_2_;
      sStack_11ee = auVar83._10_2_;
      sStack_11ec = auVar83._12_2_;
      sStack_11ea = auVar83._14_2_;
      local_1208 = auVar76._0_2_;
      sStack_1206 = auVar76._2_2_;
      sStack_1204 = auVar76._4_2_;
      sStack_1202 = auVar76._6_2_;
      sStack_1200 = auVar76._8_2_;
      sStack_11fe = auVar76._10_2_;
      sStack_11fc = auVar76._12_2_;
      sStack_11fa = auVar76._14_2_;
      local_1218 = auVar77._0_2_;
      sStack_1216 = auVar77._2_2_;
      sStack_1214 = auVar77._4_2_;
      sStack_1212 = auVar77._6_2_;
      sStack_1210 = auVar77._8_2_;
      sStack_120e = auVar77._10_2_;
      sStack_120c = auVar77._12_2_;
      sStack_120a = auVar77._14_2_;
      local_1228 = auVar78._0_2_;
      sStack_1226 = auVar78._2_2_;
      sStack_1224 = auVar78._4_2_;
      sStack_1222 = auVar78._6_2_;
      sStack_1220 = auVar78._8_2_;
      sStack_121e = auVar78._10_2_;
      sStack_121c = auVar78._12_2_;
      sStack_121a = auVar78._14_2_;
      local_1238 = auVar80._0_2_;
      sStack_1236 = auVar80._2_2_;
      sStack_1234 = auVar80._4_2_;
      sStack_1232 = auVar80._6_2_;
      sStack_1230 = auVar80._8_2_;
      sStack_122e = auVar80._10_2_;
      sStack_122c = auVar80._12_2_;
      sStack_122a = auVar80._14_2_;
      local_1248 = auVar79._0_2_;
      sStack_1246 = auVar79._2_2_;
      sStack_1244 = auVar79._4_2_;
      sStack_1242 = auVar79._6_2_;
      sStack_1240 = auVar79._8_2_;
      sStack_123e = auVar79._10_2_;
      sStack_123c = auVar79._12_2_;
      sStack_123a = auVar79._14_2_;
      local_1258 = auVar81._0_2_;
      sStack_1256 = auVar81._2_2_;
      sStack_1254 = auVar81._4_2_;
      sStack_1252 = auVar81._6_2_;
      sStack_1250 = auVar81._8_2_;
      sStack_124e = auVar81._10_2_;
      sStack_124c = auVar81._12_2_;
      sStack_124a = auVar81._14_2_;
      uVar3 = CONCAT11((0 < local_1208) * (local_1208 < 0x100) * auVar76[0] - (0xff < local_1208),
                       (0 < local_11e8) * (local_11e8 < 0x100) * auVar75[0] - (0xff < local_11e8));
      uVar2 = CONCAT13((0 < sStack_1206) * (sStack_1206 < 0x100) * auVar76[2] - (0xff < sStack_1206)
                       ,CONCAT12((0 < sStack_11e6) * (sStack_11e6 < 0x100) * auVar75[2] -
                                 (0xff < sStack_11e6),uVar3));
      uVar4 = CONCAT15((0 < sStack_1204) * (sStack_1204 < 0x100) * auVar76[4] - (0xff < sStack_1204)
                       ,CONCAT14((0 < sStack_11e4) * (sStack_11e4 < 0x100) * auVar75[4] -
                                 (0xff < sStack_11e4),uVar2));
      uStack_1e20 = CONCAT11((0 < sStack_1200) * (sStack_1200 < 0x100) * auVar76[8] -
                             (0xff < sStack_1200),
                             (0 < sStack_11e0) * (sStack_11e0 < 0x100) * auVar75[8] -
                             (0xff < sStack_11e0));
      _uStack_1e20 = CONCAT13((0 < sStack_11fe) * (sStack_11fe < 0x100) * auVar76[10] -
                              (0xff < sStack_11fe),
                              CONCAT12((0 < sStack_11de) * (sStack_11de < 0x100) * auVar75[10] -
                                       (0xff < sStack_11de),uStack_1e20));
      _uStack_1e20 = CONCAT15((0 < sStack_11fc) * (sStack_11fc < 0x100) * auVar76[0xc] -
                              (0xff < sStack_11fc),
                              CONCAT14((0 < sStack_11dc) * (sStack_11dc < 0x100) * auVar75[0xc] -
                                       (0xff < sStack_11dc),_uStack_1e20));
      _uStack_1e20 = CONCAT17((0 < sStack_11fa) * (sStack_11fa < 0x100) * auVar76[0xe] -
                              (0xff < sStack_11fa),
                              CONCAT16((0 < sStack_11da) * (sStack_11da < 0x100) * auVar75[0xe] -
                                       (0xff < sStack_11da),_uStack_1e20));
      uVar5 = CONCAT11((0 < local_1218) * (local_1218 < 0x100) * auVar77[0] - (0xff < local_1218),
                       (0 < local_11f8) * (local_11f8 < 0x100) * auVar83[0] - (0xff < local_11f8));
      uVar7 = CONCAT13((0 < sStack_1216) * (sStack_1216 < 0x100) * auVar77[2] - (0xff < sStack_1216)
                       ,CONCAT12((0 < sStack_11f6) * (sStack_11f6 < 0x100) * auVar83[2] -
                                 (0xff < sStack_11f6),uVar5));
      uVar8 = CONCAT15((0 < sStack_1214) * (sStack_1214 < 0x100) * auVar77[4] - (0xff < sStack_1214)
                       ,CONCAT14((0 < sStack_11f4) * (sStack_11f4 < 0x100) * auVar83[4] -
                                 (0xff < sStack_11f4),uVar7));
      uStack_1e30 = CONCAT11((0 < sStack_1210) * (sStack_1210 < 0x100) * auVar77[8] -
                             (0xff < sStack_1210),
                             (0 < sStack_11f0) * (sStack_11f0 < 0x100) * auVar83[8] -
                             (0xff < sStack_11f0));
      _uStack_1e30 = CONCAT13((0 < sStack_120e) * (sStack_120e < 0x100) * auVar77[10] -
                              (0xff < sStack_120e),
                              CONCAT12((0 < sStack_11ee) * (sStack_11ee < 0x100) * auVar83[10] -
                                       (0xff < sStack_11ee),uStack_1e30));
      _uStack_1e30 = CONCAT15((0 < sStack_120c) * (sStack_120c < 0x100) * auVar77[0xc] -
                              (0xff < sStack_120c),
                              CONCAT14((0 < sStack_11ec) * (sStack_11ec < 0x100) * auVar83[0xc] -
                                       (0xff < sStack_11ec),_uStack_1e30));
      _uStack_1e30 = CONCAT17((0 < sStack_120a) * (sStack_120a < 0x100) * auVar77[0xe] -
                              (0xff < sStack_120a),
                              CONCAT16((0 < sStack_11ea) * (sStack_11ea < 0x100) * auVar83[0xe] -
                                       (0xff < sStack_11ea),_uStack_1e30));
      uStack_3d6 = (undefined2)((uint)uVar2 >> 0x10);
      uStack_3d4 = (undefined2)((uint6)uVar4 >> 0x20);
      uStack_3d2 = (undefined2)
                   (CONCAT17((0 < sStack_1202) * (sStack_1202 < 0x100) * auVar76[6] -
                             (0xff < sStack_1202),
                             CONCAT16((0 < sStack_11e2) * (sStack_11e2 < 0x100) * auVar75[6] -
                                      (0xff < sStack_11e2),uVar4)) >> 0x30);
      uStack_3e6 = (undefined2)((uint)uVar7 >> 0x10);
      uStack_3e4 = (undefined2)((uint6)uVar8 >> 0x20);
      uStack_3e2 = (undefined2)
                   (CONCAT17((0 < sStack_1212) * (sStack_1212 < 0x100) * auVar77[6] -
                             (0xff < sStack_1212),
                             CONCAT16((0 < sStack_11f2) * (sStack_11f2 < 0x100) * auVar83[6] -
                                      (0xff < sStack_11f2),uVar8)) >> 0x30);
      local_1e48 = CONCAT22(uVar5,uVar3);
      _local_1e48 = CONCAT26(uStack_3e6,CONCAT24(uStack_3d6,local_1e48));
      uStack_1e40 = CONCAT22(uStack_3e4,uStack_3d4);
      _uStack_1e40 = CONCAT26(uStack_3e2,CONCAT24(uStack_3d2,uStack_1e40));
      uStack_14e = (undefined2)((uint)_uStack_1e20 >> 0x10);
      uStack_14c = (undefined2)((uint6)_uStack_1e20 >> 0x20);
      uStack_14a = (undefined2)((ulong)_uStack_1e20 >> 0x30);
      uStack_15e = (undefined2)((uint)_uStack_1e30 >> 0x10);
      uStack_15c = (undefined2)((uint6)_uStack_1e30 >> 0x20);
      uStack_15a = (undefined2)((ulong)_uStack_1e30 >> 0x30);
      local_1e58 = CONCAT22(uStack_1e30,uStack_1e20);
      _local_1e58 = CONCAT26(uStack_15e,CONCAT24(uStack_14e,local_1e58));
      uStack_1e50 = CONCAT22(uStack_15c,uStack_14c);
      _uStack_1e50 = CONCAT26(uStack_15a,CONCAT24(uStack_14a,uStack_1e50));
      uVar6 = CONCAT11((0 < local_1248) * (local_1248 < 0x100) * auVar79[0] - (0xff < local_1248),
                       (0 < local_1228) * (local_1228 < 0x100) * auVar78[0] - (0xff < local_1228));
      uVar7 = CONCAT13((0 < sStack_1246) * (sStack_1246 < 0x100) * auVar79[2] - (0xff < sStack_1246)
                       ,CONCAT12((0 < sStack_1226) * (sStack_1226 < 0x100) * auVar78[2] -
                                 (0xff < sStack_1226),uVar6));
      uVar8 = CONCAT15((0 < sStack_1244) * (sStack_1244 < 0x100) * auVar79[4] - (0xff < sStack_1244)
                       ,CONCAT14((0 < sStack_1224) * (sStack_1224 < 0x100) * auVar78[4] -
                                 (0xff < sStack_1224),uVar7));
      uVar3 = CONCAT11((0 < local_1258) * (local_1258 < 0x100) * auVar81[0] - (0xff < local_1258),
                       (0 < local_1238) * (local_1238 < 0x100) * auVar80[0] - (0xff < local_1238));
      uVar2 = CONCAT13((0 < sStack_1256) * (sStack_1256 < 0x100) * auVar81[2] - (0xff < sStack_1256)
                       ,CONCAT12((0 < sStack_1236) * (sStack_1236 < 0x100) * auVar80[2] -
                                 (0xff < sStack_1236),uVar3));
      uVar4 = CONCAT15((0 < sStack_1254) * (sStack_1254 < 0x100) * auVar81[4] - (0xff < sStack_1254)
                       ,CONCAT14((0 < sStack_1234) * (sStack_1234 < 0x100) * auVar80[4] -
                                 (0xff < sStack_1234),uVar2));
      uStack_3f6 = (undefined2)((uint)uVar7 >> 0x10);
      uStack_3f4 = (undefined2)((uint6)uVar8 >> 0x20);
      uStack_3f2 = (undefined2)
                   (CONCAT17((0 < sStack_1242) * (sStack_1242 < 0x100) * auVar79[6] -
                             (0xff < sStack_1242),
                             CONCAT16((0 < sStack_1222) * (sStack_1222 < 0x100) * auVar78[6] -
                                      (0xff < sStack_1222),uVar8)) >> 0x30);
      uStack_406 = (undefined2)((uint)uVar2 >> 0x10);
      uStack_404 = (undefined2)((uint6)uVar4 >> 0x20);
      uStack_402 = (undefined2)
                   (CONCAT17((0 < sStack_1252) * (sStack_1252 < 0x100) * auVar81[6] -
                             (0xff < sStack_1252),
                             CONCAT16((0 < sStack_1232) * (sStack_1232 < 0x100) * auVar80[6] -
                                      (0xff < sStack_1232),uVar4)) >> 0x30);
      uVar9 = CONCAT11((0 < sStack_1240) * (sStack_1240 < 0x100) * auVar79[8] - (0xff < sStack_1240)
                       ,(0 < sStack_1220) * (sStack_1220 < 0x100) * auVar78[8] -
                        (0xff < sStack_1220));
      uVar7 = CONCAT13((0 < sStack_123e) * (sStack_123e < 0x100) * auVar79[10] -
                       (0xff < sStack_123e),
                       CONCAT12((0 < sStack_121e) * (sStack_121e < 0x100) * auVar78[10] -
                                (0xff < sStack_121e),uVar9));
      uVar8 = CONCAT15((0 < sStack_123c) * (sStack_123c < 0x100) * auVar79[0xc] -
                       (0xff < sStack_123c),
                       CONCAT14((0 < sStack_121c) * (sStack_121c < 0x100) * auVar78[0xc] -
                                (0xff < sStack_121c),uVar7));
      uVar5 = CONCAT11((0 < sStack_1250) * (sStack_1250 < 0x100) * auVar81[8] - (0xff < sStack_1250)
                       ,(0 < sStack_1230) * (sStack_1230 < 0x100) * auVar80[8] -
                        (0xff < sStack_1230));
      uVar2 = CONCAT13((0 < sStack_124e) * (sStack_124e < 0x100) * auVar81[10] -
                       (0xff < sStack_124e),
                       CONCAT12((0 < sStack_122e) * (sStack_122e < 0x100) * auVar80[10] -
                                (0xff < sStack_122e),uVar5));
      uVar4 = CONCAT15((0 < sStack_124c) * (sStack_124c < 0x100) * auVar81[0xc] -
                       (0xff < sStack_124c),
                       CONCAT14((0 < sStack_122c) * (sStack_122c < 0x100) * auVar80[0xc] -
                                (0xff < sStack_122c),uVar2));
      uStack_16e = (undefined2)((uint)uVar7 >> 0x10);
      uStack_16c = (undefined2)((uint6)uVar8 >> 0x20);
      uStack_16a = (undefined2)
                   (CONCAT17((0 < sStack_123a) * (sStack_123a < 0x100) * auVar79[0xe] -
                             (0xff < sStack_123a),
                             CONCAT16((0 < sStack_121a) * (sStack_121a < 0x100) * auVar78[0xe] -
                                      (0xff < sStack_121a),uVar8)) >> 0x30);
      uStack_17e = (undefined2)((uint)uVar2 >> 0x10);
      uStack_17c = (undefined2)((uint6)uVar4 >> 0x20);
      uStack_17a = (undefined2)
                   (CONCAT17((0 < sStack_124a) * (sStack_124a < 0x100) * auVar81[0xe] -
                             (0xff < sStack_124a),
                             CONCAT16((0 < sStack_122a) * (sStack_122a < 0x100) * auVar80[0xe] -
                                      (0xff < sStack_122a),uVar4)) >> 0x30);
      uVar2 = CONCAT22(uVar3,uVar6);
      uStack_d4 = (undefined4)((ulong)_local_1e48 >> 0x20);
      uStack_e4 = (undefined4)(CONCAT26(uStack_406,CONCAT24(uStack_3f6,uVar2)) >> 0x20);
      local_1de8 = CONCAT44(uVar2,local_1e48);
      uStack_1de0._0_4_ = uStack_d4;
      uStack_1de0._4_4_ = uStack_e4;
      src_temp17_8x16b_1[0]._4_4_ = (undefined4)((ulong)_uStack_1e40 >> 0x20);
      src_temp18_8x16b_1[0]._4_4_ =
           (undefined4)
           (CONCAT26(uStack_402,CONCAT24(uStack_3f2,CONCAT22(uStack_404,uStack_3f4))) >> 0x20);
      local_1df8 = CONCAT44(CONCAT22(uStack_404,uStack_3f4),uStack_1e40);
      uStack_1df0._0_4_ = src_temp17_8x16b_1[0]._4_4_;
      uStack_1df0._4_4_ = src_temp18_8x16b_1[0]._4_4_;
      uVar2 = CONCAT22(uVar5,uVar9);
      uStack_f4 = (undefined4)((ulong)_local_1e58 >> 0x20);
      uStack_104 = (undefined4)(CONCAT26(uStack_17e,CONCAT24(uStack_16e,uVar2)) >> 0x20);
      local_1e08 = CONCAT44(uVar2,local_1e58);
      uStack_1e00._0_4_ = uStack_f4;
      uStack_1e00._4_4_ = uStack_104;
      uStack_6c = (undefined4)((ulong)_uStack_1e50 >> 0x20);
      uStack_7c = (undefined4)
                  (CONCAT26(uStack_17a,CONCAT24(uStack_16a,CONCAT22(uStack_17c,uStack_16c))) >> 0x20
                  );
      local_1e18 = CONCAT44(CONCAT22(uStack_17c,uStack_16c),uStack_1e50);
      uStack_1e10._0_4_ = uStack_6c;
      uStack_1e10._4_4_ = uStack_7c;
      *in_RDX = uStack_1e10;
      *(undefined8 *)((long)in_RDX + (long)in_ECX) = local_1e18;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX * 2)) = uStack_1e00;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX * 3)) = local_1e08;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX << 2)) = uStack_1df0;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX * 5)) = local_1df8;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX * 6)) = uStack_1de0;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX * 7)) = local_1de8;
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_mode_3_to_9_sse42(UWORD8 *pu1_ref,
                                             WORD32 src_strd,
                                             UWORD8 *pu1_dst,
                                             WORD32 dst_strd,
                                             WORD32 nt,
                                             WORD32 mode)
{
    WORD32 row, col;
    WORD32 two_nt = 2 * nt;
    WORD32 intra_pred_ang;


    __m128i const_temp_4x32b, const_temp2_4x32b, const_temp3_4x32b, const_temp4_4x32b;
    __m128i fract_4x32b, intra_pred_ang_4x32b;
    __m128i row_4x32b, two_nt_4x32b, ref_main_idx_4x32b, res_temp5_4x32b, sm3;
    UNUSED(src_strd);


    /* Intra Pred Angle according to the mode */
    intra_pred_ang = gai4_ihevc_ang_table[mode];

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */

    /* For the angles other then 45 degree, interpolation btw 2 neighboring */
    /* samples dependent on distance to obtain destination sample */

    const_temp_4x32b  = _mm_set1_epi16(16);
    const_temp2_4x32b = _mm_set1_epi32(31);
    const_temp3_4x32b = _mm_set1_epi32(32);
    const_temp4_4x32b = _mm_set1_epi32(4);

    two_nt_4x32b = _mm_set1_epi32(two_nt - nt);


    sm3 = _mm_load_si128((__m128i *)&IHEVCE_SHUFFLEMASKY11[0]);

    /* intra_pred_ang = gai4_ihevc_ang_table[mode]; */
    intra_pred_ang_4x32b = _mm_set1_epi32(intra_pred_ang);

    row_4x32b = _mm_set_epi32(4, 3, 2, 1);

    if(nt == 4)
    {

        WORD32 ref_main_idx1, ref_main_idx2, ref_main_idx3, ref_main_idx4;
        int temp11, temp21, temp31, temp41;
        // WORD8  ai1_fract_temp_val[16], ai1_row_temp_val[16];

        __m128i fract1_8x16b, fract2_8x16b;
        __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;

        __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
        __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b; //, src_temp8_8x16b;
        __m128i ref_main_temp0, ref_main_temp1, ref_main_temp2;

        /* pos = ((row + 1) * intra_pred_ang); */
        res_temp5_4x32b  = _mm_mullo_epi32(row_4x32b, intra_pred_ang_4x32b);

        /* idx = pos >> 5; */
        fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

        /* fract = pos & (31); */
        ref_main_idx_4x32b = _mm_sub_epi32(two_nt_4x32b, _mm_srai_epi32(res_temp5_4x32b,  5));

        /*(32 - fract) */
        row_4x32b = _mm_sub_epi32(const_temp3_4x32b, fract_4x32b);

        fract1_8x16b = _mm_slli_epi16(fract_4x32b, 8);
        fract2_8x16b = _mm_slli_epi16(row_4x32b, 8);

        fract_4x32b = _mm_or_si128(fract_4x32b, fract1_8x16b);
        row_4x32b = _mm_or_si128(row_4x32b, fract2_8x16b); /*(32 - fract) */

        fract2_8x16b = _mm_unpackhi_epi8(row_4x32b, fract_4x32b);
        fract1_8x16b = _mm_unpacklo_epi8(row_4x32b, fract_4x32b);

        temp1_8x16b =  _mm_shuffle_epi32(fract1_8x16b, 0x00);
        temp2_8x16b =  _mm_shuffle_epi32(fract1_8x16b, 0xaa);
        temp3_8x16b =  _mm_shuffle_epi32(fract2_8x16b, 0x00);
        temp4_8x16b =  _mm_shuffle_epi32(fract2_8x16b, 0xaa);

        ref_main_temp0 = _mm_srli_si128(ref_main_idx_4x32b, 4);  /* next 32 bit values */
        ref_main_temp1 = _mm_srli_si128(ref_main_idx_4x32b, 8);  /* next 32 bit values */
        ref_main_temp2 = _mm_srli_si128(ref_main_idx_4x32b, 12); /* next 32 bit values */
        ref_main_idx1  = _mm_cvtsi128_si32(ref_main_idx_4x32b);    /* col=0*/
        ref_main_idx2  = _mm_cvtsi128_si32(ref_main_temp0);  /* col=1*/
        ref_main_idx3  = _mm_cvtsi128_si32(ref_main_temp1);  /* col=2*/
        ref_main_idx4  = _mm_cvtsi128_si32(ref_main_temp2);  /* col=3*/

        /* loding 8-bit 16 pixels */
        src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx1 - 1)); /* col=0*/
        src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx2 - 1)); /* col=1*/
        src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx3 - 1)); /* col=2*/
        src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + ref_main_idx4 - 1)); /* col=3*/

        src_temp1_8x16b =  _mm_shuffle_epi8(src_temp1_8x16b, sm3); /* col=0*/
        src_temp2_8x16b =  _mm_shuffle_epi8(src_temp2_8x16b, sm3); /* col=1*/
        src_temp3_8x16b =  _mm_shuffle_epi8(src_temp3_8x16b, sm3); /* col=2*/
        src_temp4_8x16b =  _mm_shuffle_epi8(src_temp4_8x16b, sm3); /* col=3*/

        /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
        src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
        src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
        src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
        src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

        /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
        src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
        src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
        src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
        src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

        /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
        src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
        src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
        src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
        src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

        /* converting 16 bit to 8 bit */
        src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp3_8x16b); /* col=0*/
        src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, src_temp4_8x16b); /* col=1*/


        src_temp5_8x16b = _mm_unpacklo_epi8(src_temp1_8x16b, src_temp2_8x16b);
        src_temp6_8x16b = _mm_unpackhi_epi8(src_temp1_8x16b, src_temp2_8x16b);

        src_temp3_8x16b = _mm_unpacklo_epi16(src_temp5_8x16b, src_temp6_8x16b);
        src_temp2_8x16b = _mm_srli_si128(src_temp3_8x16b, 4);
        src_temp1_8x16b = _mm_srli_si128(src_temp3_8x16b, 8);
        src_temp7_8x16b = _mm_srli_si128(src_temp3_8x16b, 12);

        temp11 = _mm_cvtsi128_si32(src_temp7_8x16b);
        temp21 = _mm_cvtsi128_si32(src_temp1_8x16b);
        temp31 = _mm_cvtsi128_si32(src_temp2_8x16b);
        temp41 = _mm_cvtsi128_si32(src_temp3_8x16b);

        /* loding 4-bit 8 pixels values */
        *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp11;
        *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp21;
        *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp31;
        *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp41;

    }

    else if(nt == 16 || nt == 32)
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(8);
        const_temp3_4x32b = _mm_set1_epi16(32);
        two_nt_4x32b = _mm_set1_epi16(two_nt);

        for(col = 0; col < nt; col += 8)
        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD16 pi2_ref_main_idx5, pi2_ref_main_idx6, pi2_ref_main_idx7, pi2_ref_main_idx8;
            //WORD8  ai1_fract_temp0_val[16], ai1_fract_temp1_val[16];

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract8_8x16b;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;
            __m128i temp11_8x16b, temp12_8x16b, temp13_8x16b, temp14_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* idx = pos >> 5; */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            /*(32 - fract) */
            fract2_8x16b =  _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            fract1_8x16b = _mm_slli_epi16(fract_4x32b, 8);
            fract3_8x16b = _mm_slli_epi16(fract2_8x16b, 8); /*(32 - fract) */

            fract_4x32b = _mm_or_si128(fract_4x32b, fract1_8x16b);
            fract2_8x16b = _mm_or_si128(fract2_8x16b, fract3_8x16b); /*(32 - fract) */


            fract8_8x16b = _mm_unpackhi_epi8(fract2_8x16b, fract_4x32b);
            fract_4x32b = _mm_unpacklo_epi8(fract2_8x16b, fract_4x32b);

            temp1_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x00);
            temp2_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x55);
            temp3_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xaa);
            temp4_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xff);

            temp11_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x00);
            temp12_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x55);
            temp13_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xaa);
            temp14_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xff);

            /* fract = pos & (31); */
            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, _mm_srai_epi16(res_temp5_4x32b,  5));

            row_4x32b = _mm_add_epi16(row_4x32b, const_temp4_4x32b);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            pi2_ref_main_idx5 = _mm_extract_epi16(ref_main_idx_4x32b, 4);    /* col=5*/
            pi2_ref_main_idx6 = _mm_extract_epi16(ref_main_idx_4x32b, 5);    /* col=6*/
            pi2_ref_main_idx7 = _mm_extract_epi16(ref_main_idx_4x32b, 6);    /* col=7*/
            pi2_ref_main_idx8 = _mm_extract_epi16(ref_main_idx_4x32b, 7);    /* col=8*/

            for(row = 0; row < nt; row += 8)
            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;


                __m128i src_temp11_8x16b, src_temp12_8x16b, src_temp13_8x16b, src_temp14_8x16b;
                __m128i src_temp15_8x16b, src_temp16_8x16b, src_temp17_8x16b, src_temp18_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - 1 - (8 + row))); /* col=0*/
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - 1 - (8 + row))); /* col=1*/
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - 1 - (8 + row))); /* col=2*/
                src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - 1 - (8 + row))); /* col=3*/

                /* loding 8-bit 16 pixels */
                src_temp11_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx5 - 1 - (8 + row))); /* col=5*/
                src_temp12_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx6 - 1 - (8 + row))); /* col=6*/
                src_temp13_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx7 - 1 - (8 + row))); /* col=7*/
                src_temp14_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx8 - 1 - (8 + row))); /* col=8*/

                src_temp1_8x16b =  _mm_shuffle_epi8(src_temp1_8x16b, sm3); /* col=0*/
                src_temp2_8x16b =  _mm_shuffle_epi8(src_temp2_8x16b, sm3); /* col=1*/
                src_temp3_8x16b =  _mm_shuffle_epi8(src_temp3_8x16b, sm3); /* col=2*/
                src_temp4_8x16b =  _mm_shuffle_epi8(src_temp4_8x16b, sm3); /* col=3*/

                src_temp11_8x16b =  _mm_shuffle_epi8(src_temp11_8x16b, sm3); /* col=0*/
                src_temp12_8x16b =  _mm_shuffle_epi8(src_temp12_8x16b, sm3); /* col=1*/
                src_temp13_8x16b =  _mm_shuffle_epi8(src_temp13_8x16b, sm3); /* col=2*/
                src_temp14_8x16b =  _mm_shuffle_epi8(src_temp14_8x16b, sm3); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp11_8x16b = _mm_maddubs_epi16(src_temp11_8x16b, temp11_8x16b);
                src_temp12_8x16b = _mm_maddubs_epi16(src_temp12_8x16b, temp12_8x16b);
                src_temp13_8x16b = _mm_maddubs_epi16(src_temp13_8x16b, temp13_8x16b);
                src_temp14_8x16b = _mm_maddubs_epi16(src_temp14_8x16b, temp14_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp11_8x16b = _mm_add_epi16(src_temp11_8x16b, const_temp_4x32b);
                src_temp12_8x16b = _mm_add_epi16(src_temp12_8x16b, const_temp_4x32b);
                src_temp13_8x16b = _mm_add_epi16(src_temp13_8x16b, const_temp_4x32b);
                src_temp14_8x16b = _mm_add_epi16(src_temp14_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp11_8x16b = _mm_srai_epi16(src_temp11_8x16b,  5);   /* col=5*/
                src_temp12_8x16b = _mm_srai_epi16(src_temp12_8x16b,  5);   /* col=6*/
                src_temp13_8x16b = _mm_srai_epi16(src_temp13_8x16b,  5);   /* col=7*/
                src_temp14_8x16b = _mm_srai_epi16(src_temp14_8x16b,  5);   /* col=8*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp3_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, src_temp4_8x16b); /* col=1*/

                /* converting 16 bit to 8 bit */
                src_temp11_8x16b = _mm_packus_epi16(src_temp11_8x16b, src_temp13_8x16b); /* col=5*/
                src_temp12_8x16b = _mm_packus_epi16(src_temp12_8x16b, src_temp14_8x16b); /* col=6*/

                src_temp5_8x16b = _mm_unpacklo_epi8(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpackhi_epi8(src_temp1_8x16b, src_temp2_8x16b);

                src_temp15_8x16b = _mm_unpacklo_epi8(src_temp11_8x16b, src_temp12_8x16b);
                src_temp16_8x16b = _mm_unpackhi_epi8(src_temp11_8x16b, src_temp12_8x16b);

                src_temp7_8x16b = _mm_unpacklo_epi16(src_temp5_8x16b, src_temp6_8x16b);
                src_temp8_8x16b = _mm_unpackhi_epi16(src_temp5_8x16b, src_temp6_8x16b);

                src_temp17_8x16b = _mm_unpacklo_epi16(src_temp15_8x16b, src_temp16_8x16b);
                src_temp18_8x16b = _mm_unpackhi_epi16(src_temp15_8x16b, src_temp16_8x16b);

                src_temp1_8x16b = _mm_unpacklo_epi32(src_temp7_8x16b, src_temp17_8x16b);
                src_temp2_8x16b = _mm_unpackhi_epi32(src_temp7_8x16b, src_temp17_8x16b);

                src_temp5_8x16b = _mm_srli_si128(src_temp1_8x16b, 8);
                src_temp6_8x16b = _mm_srli_si128(src_temp2_8x16b, 8);

                src_temp3_8x16b = _mm_unpacklo_epi32(src_temp8_8x16b, src_temp18_8x16b);
                src_temp4_8x16b = _mm_unpackhi_epi32(src_temp8_8x16b, src_temp18_8x16b);

                src_temp7_8x16b = _mm_srli_si128(src_temp3_8x16b, 8);
                src_temp8_8x16b = _mm_srli_si128(src_temp4_8x16b, 8);

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 7))), src_temp1_8x16b);          /* row=7*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 6))), src_temp5_8x16b);       /* row=6*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 5))), src_temp2_8x16b);       /* row=5*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 4))), src_temp6_8x16b);       /* row=4*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 3))), src_temp3_8x16b);       /* row=3*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 2))), src_temp7_8x16b);       /* row=2*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 1))), src_temp4_8x16b);       /* row=1*/

                _mm_storel_epi64((__m128i *)(pu1_dst + col + (dst_strd * (row + 0))), src_temp8_8x16b);       /* row=0*/

            }
        }
    }
    else
    {
        intra_pred_ang_4x32b = _mm_set1_epi16(intra_pred_ang);
        row_4x32b = _mm_set_epi16(8, 7, 6, 5, 4, 3, 2, 1);
        const_temp2_4x32b = _mm_set1_epi16(31);
        const_temp4_4x32b = _mm_set1_epi16(8);
        const_temp3_4x32b = _mm_set1_epi16(32);
        two_nt_4x32b = _mm_set1_epi16(two_nt - nt);
        {
            WORD16 pi2_ref_main_idx1, pi2_ref_main_idx2, pi2_ref_main_idx3, pi2_ref_main_idx4;
            WORD16 pi2_ref_main_idx5, pi2_ref_main_idx6, pi2_ref_main_idx7, pi2_ref_main_idx8;

            __m128i fract1_8x16b, fract2_8x16b, fract3_8x16b, fract8_8x16b;

            __m128i temp1_8x16b, temp2_8x16b, temp3_8x16b, temp4_8x16b;
            __m128i temp11_8x16b, temp12_8x16b, temp13_8x16b, temp14_8x16b;

            /* pos = ((row + 1) * intra_pred_ang); */
            res_temp5_4x32b  = _mm_mullo_epi16(row_4x32b, intra_pred_ang_4x32b);

            /* idx = pos >> 5; */
            fract_4x32b = _mm_and_si128(res_temp5_4x32b, const_temp2_4x32b);

            /* fract = pos & (31); */
            ref_main_idx_4x32b = _mm_sub_epi16(two_nt_4x32b, _mm_srai_epi16(res_temp5_4x32b,  5));

            /*(32 - fract) */
            fract2_8x16b =  _mm_sub_epi16(const_temp3_4x32b, fract_4x32b);

            fract1_8x16b = _mm_slli_epi16(fract_4x32b, 8);
            fract3_8x16b = _mm_slli_epi16(fract2_8x16b, 8); /*(32 - fract) */

            fract_4x32b = _mm_or_si128(fract_4x32b, fract1_8x16b);
            fract2_8x16b = _mm_or_si128(fract2_8x16b, fract3_8x16b); /*(32 - fract) */


            fract8_8x16b = _mm_unpackhi_epi8(fract2_8x16b, fract_4x32b);
            fract_4x32b = _mm_unpacklo_epi8(fract2_8x16b, fract_4x32b);

            temp1_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x00);
            temp2_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0x55);
            temp3_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xaa);
            temp4_8x16b =  _mm_shuffle_epi32(fract_4x32b, 0xff);

            temp11_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x00);
            temp12_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0x55);
            temp13_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xaa);
            temp14_8x16b =  _mm_shuffle_epi32(fract8_8x16b, 0xff);

            pi2_ref_main_idx1 = _mm_extract_epi16(ref_main_idx_4x32b, 0);    /* col=0*/
            pi2_ref_main_idx2 = _mm_extract_epi16(ref_main_idx_4x32b, 1);    /* col=1*/
            pi2_ref_main_idx3 = _mm_extract_epi16(ref_main_idx_4x32b, 2);    /* col=2*/
            pi2_ref_main_idx4 = _mm_extract_epi16(ref_main_idx_4x32b, 3);    /* col=3*/

            pi2_ref_main_idx5 = _mm_extract_epi16(ref_main_idx_4x32b, 4);    /* col=5*/
            pi2_ref_main_idx6 = _mm_extract_epi16(ref_main_idx_4x32b, 5);    /* col=6*/
            pi2_ref_main_idx7 = _mm_extract_epi16(ref_main_idx_4x32b, 6);    /* col=7*/
            pi2_ref_main_idx8 = _mm_extract_epi16(ref_main_idx_4x32b, 7);    /* col=8*/

            {
                __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
                __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;

                __m128i src_temp11_8x16b, src_temp12_8x16b, src_temp13_8x16b, src_temp14_8x16b;
                __m128i src_temp15_8x16b, src_temp16_8x16b, src_temp17_8x16b, src_temp18_8x16b;

                /* loding 8-bit 16 pixels */
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx1 - 1)); /* col=0*/
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx2 - 1)); /* col=1*/
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx3 - 1)); /* col=2*/
                src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx4 - 1)); /* col=3*/

                /* loding 8-bit 16 pixels */
                src_temp11_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx5 - 1)); /* col=5*/
                src_temp12_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx6 - 1)); /* col=6*/
                src_temp13_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx7 - 1)); /* col=7*/
                src_temp14_8x16b = _mm_loadu_si128((__m128i *)(pu1_ref + pi2_ref_main_idx8 - 1)); /* col=8*/

                src_temp1_8x16b =  _mm_shuffle_epi8(src_temp1_8x16b, sm3); /* col=0*/
                src_temp2_8x16b =  _mm_shuffle_epi8(src_temp2_8x16b, sm3); /* col=1*/
                src_temp3_8x16b =  _mm_shuffle_epi8(src_temp3_8x16b, sm3); /* col=2*/
                src_temp4_8x16b =  _mm_shuffle_epi8(src_temp4_8x16b, sm3); /* col=3*/

                src_temp11_8x16b =  _mm_shuffle_epi8(src_temp11_8x16b, sm3); /* col=0*/
                src_temp12_8x16b =  _mm_shuffle_epi8(src_temp12_8x16b, sm3); /* col=1*/
                src_temp13_8x16b =  _mm_shuffle_epi8(src_temp13_8x16b, sm3); /* col=2*/
                src_temp14_8x16b =  _mm_shuffle_epi8(src_temp14_8x16b, sm3); /* col=3*/

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp1_8x16b = _mm_maddubs_epi16(src_temp1_8x16b, temp1_8x16b);
                src_temp2_8x16b = _mm_maddubs_epi16(src_temp2_8x16b, temp2_8x16b);
                src_temp3_8x16b = _mm_maddubs_epi16(src_temp3_8x16b, temp3_8x16b);
                src_temp4_8x16b = _mm_maddubs_epi16(src_temp4_8x16b, temp4_8x16b);

                /* fract*(pu1_ref[ref_main_idx + 1]- pu1_ref[ref_main_idx]) */
                src_temp11_8x16b = _mm_maddubs_epi16(src_temp11_8x16b, temp11_8x16b);
                src_temp12_8x16b = _mm_maddubs_epi16(src_temp12_8x16b, temp12_8x16b);
                src_temp13_8x16b = _mm_maddubs_epi16(src_temp13_8x16b, temp13_8x16b);
                src_temp14_8x16b = _mm_maddubs_epi16(src_temp14_8x16b, temp14_8x16b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp1_8x16b = _mm_add_epi16(src_temp1_8x16b, const_temp_4x32b);
                src_temp2_8x16b = _mm_add_epi16(src_temp2_8x16b, const_temp_4x32b);
                src_temp3_8x16b = _mm_add_epi16(src_temp3_8x16b, const_temp_4x32b);
                src_temp4_8x16b = _mm_add_epi16(src_temp4_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  5);   /* col=0*/
                src_temp2_8x16b = _mm_srai_epi16(src_temp2_8x16b,  5);   /* col=1*/
                src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  5);   /* col=2*/
                src_temp4_8x16b = _mm_srai_epi16(src_temp4_8x16b,  5);   /* col=3*/

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16)*/
                src_temp11_8x16b = _mm_add_epi16(src_temp11_8x16b, const_temp_4x32b);
                src_temp12_8x16b = _mm_add_epi16(src_temp12_8x16b, const_temp_4x32b);
                src_temp13_8x16b = _mm_add_epi16(src_temp13_8x16b, const_temp_4x32b);
                src_temp14_8x16b = _mm_add_epi16(src_temp14_8x16b, const_temp_4x32b);

                /*((32 - fract)* pu1_ref[ref_main_idx]+ fract * pu1_ref[ref_main_idx + 1] + 16) >>5*/
                src_temp11_8x16b = _mm_srai_epi16(src_temp11_8x16b,  5);   /* col=5*/
                src_temp12_8x16b = _mm_srai_epi16(src_temp12_8x16b,  5);   /* col=6*/
                src_temp13_8x16b = _mm_srai_epi16(src_temp13_8x16b,  5);   /* col=7*/
                src_temp14_8x16b = _mm_srai_epi16(src_temp14_8x16b,  5);   /* col=8*/

                /* converting 16 bit to 8 bit */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp3_8x16b); /* col=0*/
                src_temp2_8x16b = _mm_packus_epi16(src_temp2_8x16b, src_temp4_8x16b); /* col=1*/

                /* converting 16 bit to 8 bit */
                src_temp11_8x16b = _mm_packus_epi16(src_temp11_8x16b, src_temp13_8x16b); /* col=5*/
                src_temp12_8x16b = _mm_packus_epi16(src_temp12_8x16b, src_temp14_8x16b); /* col=6*/

                src_temp5_8x16b = _mm_unpacklo_epi8(src_temp1_8x16b, src_temp2_8x16b);
                src_temp6_8x16b = _mm_unpackhi_epi8(src_temp1_8x16b, src_temp2_8x16b);

                src_temp15_8x16b = _mm_unpacklo_epi8(src_temp11_8x16b, src_temp12_8x16b);
                src_temp16_8x16b = _mm_unpackhi_epi8(src_temp11_8x16b, src_temp12_8x16b);

                src_temp7_8x16b = _mm_unpacklo_epi16(src_temp5_8x16b, src_temp6_8x16b);
                src_temp8_8x16b = _mm_unpackhi_epi16(src_temp5_8x16b, src_temp6_8x16b);

                src_temp17_8x16b = _mm_unpacklo_epi16(src_temp15_8x16b, src_temp16_8x16b);
                src_temp18_8x16b = _mm_unpackhi_epi16(src_temp15_8x16b, src_temp16_8x16b);

                src_temp1_8x16b = _mm_unpacklo_epi32(src_temp7_8x16b, src_temp17_8x16b);
                src_temp2_8x16b = _mm_unpackhi_epi32(src_temp7_8x16b, src_temp17_8x16b);

                src_temp5_8x16b = _mm_srli_si128(src_temp1_8x16b, 8);
                src_temp6_8x16b = _mm_srli_si128(src_temp2_8x16b, 8);

                src_temp3_8x16b = _mm_unpacklo_epi32(src_temp8_8x16b, src_temp18_8x16b);
                src_temp4_8x16b = _mm_unpackhi_epi32(src_temp8_8x16b, src_temp18_8x16b);

                src_temp7_8x16b = _mm_srli_si128(src_temp3_8x16b, 8);
                src_temp8_8x16b = _mm_srli_si128(src_temp4_8x16b, 8);

                _mm_storel_epi64((__m128i *)(pu1_dst), src_temp8_8x16b);       /* row=0*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 1)), src_temp4_8x16b);       /* row=1*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 2)), src_temp7_8x16b);       /* row=2*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 3)), src_temp3_8x16b);       /* row=3*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 4)), src_temp6_8x16b);       /* row=4*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 5)), src_temp2_8x16b);       /* row=5*/

                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 6)), src_temp5_8x16b);       /* row=6*/
                _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd * 7)), src_temp1_8x16b);          /* row=7*/

            }
        }
    }

}